

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::sse2::CurveNvIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  Primitive *pPVar2;
  Primitive *pPVar3;
  Primitive *pPVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined6 uVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  vfloat_impl<4> vVar43;
  int iVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  long lVar47;
  StackEntry *pSVar48;
  RTCRayN *extraout_RAX;
  RTCRayN *extraout_RAX_00;
  RTCRayN *pRVar50;
  int iVar51;
  ulong uVar52;
  ulong uVar53;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong uVar54;
  bool bVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  short sVar64;
  float fVar65;
  float fVar104;
  float fVar105;
  __m128 a_1;
  undefined2 uVar103;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar106;
  undefined8 uVar107;
  float fVar131;
  vfloat4 v;
  float fVar130;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar132;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar142;
  float fVar159;
  float fVar160;
  vfloat4 v_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar161;
  float fVar170;
  float fVar171;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar168 [16];
  float fVar172;
  float fVar204;
  float fVar206;
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  float fVar173;
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  float fVar205;
  float fVar207;
  float fVar208;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar209;
  float fVar219;
  float fVar221;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar210;
  float fVar220;
  float fVar222;
  float fVar223;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar224;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar232;
  float fVar233;
  float fVar245;
  float fVar247;
  undefined1 auVar234 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar246;
  float fVar248;
  float fVar249;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar243;
  undefined1 auVar244 [16];
  float fVar250;
  float fVar251;
  float fVar257;
  float fVar259;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar258;
  float fVar260;
  float fVar261;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar262;
  float fVar263;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar264 [16];
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar275;
  float fVar279;
  vfloat4 a;
  float fVar283;
  undefined1 auVar273 [16];
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar274 [16];
  float fVar287;
  float fVar296;
  float fVar300;
  float fVar304;
  undefined1 auVar291 [16];
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar305;
  float fVar306;
  float fVar307;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar308;
  float fVar309;
  float fVar313;
  float fVar314;
  float fVar316;
  float fVar317;
  float fVar318;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  uint uVar315;
  uint uVar319;
  undefined1 auVar312 [16];
  float fVar320;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  uint local_5ec;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  RTCFilterFunctionNArguments args;
  int local_4ec;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  vfloatx vu0;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_328 [16];
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  Primitive *local_2c8;
  Primitive *local_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  undefined1 local_108 [16];
  StackEntry stack [4];
  ulong uVar49;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 uVar102;
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined1 auVar198 [16];
  undefined1 auVar200 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  
  PVar7 = prim[1];
  uVar53 = (ulong)(byte)PVar7;
  fVar131 = *(float *)(prim + uVar53 * 0x19 + 0x12);
  fVar142 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)(prim + uVar53 * 0x19 + 6)) *
            fVar131;
  fVar159 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(prim + uVar53 * 0x19 + 10)) *
            fVar131;
  fVar160 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(prim + uVar53 * 0x19 + 0xe)) *
            fVar131;
  fVar106 = fVar131 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar130 = fVar131 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar131 = fVar131 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar46 = *(undefined4 *)(prim + uVar53 * 4 + 6);
  uVar102 = (undefined1)((uint)uVar46 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar46 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar46));
  uVar102 = (undefined1)((uint)uVar46 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar102),uVar102);
  sVar64 = CONCAT11((char)uVar46,(char)uVar46);
  uVar54 = CONCAT62(uVar27,sVar64);
  auVar195._8_4_ = 0;
  auVar195._0_8_ = uVar54;
  auVar195._12_2_ = uVar103;
  auVar195._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar253._12_4_ = auVar195._12_4_;
  auVar253._8_2_ = 0;
  auVar253._0_8_ = uVar54;
  auVar253._10_2_ = uVar103;
  auVar73._10_6_ = auVar253._10_6_;
  auVar73._8_2_ = uVar103;
  auVar73._0_8_ = uVar54;
  uVar103 = (undefined2)uVar27;
  auVar28._4_8_ = auVar73._8_8_;
  auVar28._2_2_ = uVar103;
  auVar28._0_2_ = uVar103;
  fVar132 = (float)((int)sVar64 >> 8);
  fVar139 = (float)(auVar28._0_4_ >> 0x18);
  fVar140 = (float)(auVar73._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar53 * 5 + 6);
  uVar102 = (undefined1)((uint)uVar46 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar46 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar46));
  uVar102 = (undefined1)((uint)uVar46 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar102),uVar102);
  sVar64 = CONCAT11((char)uVar46,(char)uVar46);
  uVar54 = CONCAT62(uVar27,sVar64);
  auVar214._8_4_ = 0;
  auVar214._0_8_ = uVar54;
  auVar214._12_2_ = uVar103;
  auVar214._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar66._12_4_ = auVar214._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar54;
  auVar66._10_2_ = uVar103;
  auVar293._10_6_ = auVar66._10_6_;
  auVar293._8_2_ = uVar103;
  auVar293._0_8_ = uVar54;
  uVar103 = (undefined2)uVar27;
  auVar29._4_8_ = auVar293._8_8_;
  auVar29._2_2_ = uVar103;
  auVar29._0_2_ = uVar103;
  fVar161 = (float)((int)sVar64 >> 8);
  fVar170 = (float)(auVar29._0_4_ >> 0x18);
  fVar171 = (float)(auVar293._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar53 * 6 + 6);
  uVar102 = (undefined1)((uint)uVar46 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar46 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar46));
  uVar102 = (undefined1)((uint)uVar46 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar102),uVar102);
  sVar64 = CONCAT11((char)uVar46,(char)uVar46);
  uVar54 = CONCAT62(uVar27,sVar64);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar54;
  auVar69._12_2_ = uVar103;
  auVar69._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar54;
  auVar68._10_2_ = uVar103;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar103;
  auVar67._0_8_ = uVar54;
  uVar103 = (undefined2)uVar27;
  auVar30._4_8_ = auVar67._8_8_;
  auVar30._2_2_ = uVar103;
  auVar30._0_2_ = uVar103;
  fVar224 = (float)((int)sVar64 >> 8);
  fVar227 = (float)(auVar30._0_4_ >> 0x18);
  fVar229 = (float)(auVar67._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar53 * 0xb + 6);
  uVar102 = (undefined1)((uint)uVar46 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar46 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar46));
  uVar102 = (undefined1)((uint)uVar46 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar102),uVar102);
  sVar64 = CONCAT11((char)uVar46,(char)uVar46);
  uVar54 = CONCAT62(uVar27,sVar64);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar54;
  auVar72._12_2_ = uVar103;
  auVar72._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar54;
  auVar71._10_2_ = uVar103;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar103;
  auVar70._0_8_ = uVar54;
  uVar103 = (undefined2)uVar27;
  auVar31._4_8_ = auVar70._8_8_;
  auVar31._2_2_ = uVar103;
  auVar31._0_2_ = uVar103;
  fVar65 = (float)((int)sVar64 >> 8);
  fVar104 = (float)(auVar31._0_4_ >> 0x18);
  fVar105 = (float)(auVar70._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar53 * 0xc + 6);
  uVar102 = (undefined1)((uint)uVar46 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar46 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar46));
  uVar102 = (undefined1)((uint)uVar46 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar102),uVar102);
  sVar64 = CONCAT11((char)uVar46,(char)uVar46);
  uVar54 = CONCAT62(uVar27,sVar64);
  auVar176._8_4_ = 0;
  auVar176._0_8_ = uVar54;
  auVar176._12_2_ = uVar103;
  auVar176._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar54;
  auVar175._10_2_ = uVar103;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._8_2_ = uVar103;
  auVar174._0_8_ = uVar54;
  uVar103 = (undefined2)uVar27;
  auVar32._4_8_ = auVar174._8_8_;
  auVar32._2_2_ = uVar103;
  auVar32._0_2_ = uVar103;
  fVar209 = (float)((int)sVar64 >> 8);
  fVar219 = (float)(auVar32._0_4_ >> 0x18);
  fVar221 = (float)(auVar174._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar53 * 0xd + 6);
  uVar102 = (undefined1)((uint)uVar46 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar46 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar46));
  uVar102 = (undefined1)((uint)uVar46 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar102),uVar102);
  sVar64 = CONCAT11((char)uVar46,(char)uVar46);
  uVar54 = CONCAT62(uVar27,sVar64);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar54;
  auVar179._12_2_ = uVar103;
  auVar179._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar54;
  auVar178._10_2_ = uVar103;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar103;
  auVar177._0_8_ = uVar54;
  uVar103 = (undefined2)uVar27;
  auVar33._4_8_ = auVar177._8_8_;
  auVar33._2_2_ = uVar103;
  auVar33._0_2_ = uVar103;
  fVar250 = (float)((int)sVar64 >> 8);
  fVar257 = (float)(auVar33._0_4_ >> 0x18);
  fVar259 = (float)(auVar177._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar53 * 0x12 + 6);
  uVar102 = (undefined1)((uint)uVar46 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar46 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar46));
  uVar102 = (undefined1)((uint)uVar46 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar102),uVar102);
  sVar64 = CONCAT11((char)uVar46,(char)uVar46);
  uVar54 = CONCAT62(uVar27,sVar64);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar54;
  auVar182._12_2_ = uVar103;
  auVar182._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar54;
  auVar181._10_2_ = uVar103;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar103;
  auVar180._0_8_ = uVar54;
  uVar103 = (undefined2)uVar27;
  auVar34._4_8_ = auVar180._8_8_;
  auVar34._2_2_ = uVar103;
  auVar34._0_2_ = uVar103;
  fVar232 = (float)((int)sVar64 >> 8);
  fVar245 = (float)(auVar34._0_4_ >> 0x18);
  fVar247 = (float)(auVar180._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar53 * 0x13 + 6);
  uVar102 = (undefined1)((uint)uVar46 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar46 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar46));
  uVar102 = (undefined1)((uint)uVar46 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar102),uVar102);
  sVar64 = CONCAT11((char)uVar46,(char)uVar46);
  uVar54 = CONCAT62(uVar27,sVar64);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar54;
  auVar185._12_2_ = uVar103;
  auVar185._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar54;
  auVar184._10_2_ = uVar103;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar103;
  auVar183._0_8_ = uVar54;
  uVar103 = (undefined2)uVar27;
  auVar35._4_8_ = auVar183._8_8_;
  auVar35._2_2_ = uVar103;
  auVar35._0_2_ = uVar103;
  fVar262 = (float)((int)sVar64 >> 8);
  fVar265 = (float)(auVar35._0_4_ >> 0x18);
  fVar267 = (float)(auVar183._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar53 * 0x14 + 6);
  uVar102 = (undefined1)((uint)uVar46 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar46 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar46));
  uVar102 = (undefined1)((uint)uVar46 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar102),uVar102);
  sVar64 = CONCAT11((char)uVar46,(char)uVar46);
  uVar54 = CONCAT62(uVar27,sVar64);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar54;
  auVar188._12_2_ = uVar103;
  auVar188._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar54;
  auVar187._10_2_ = uVar103;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar103;
  auVar186._0_8_ = uVar54;
  uVar103 = (undefined2)uVar27;
  auVar36._4_8_ = auVar186._8_8_;
  auVar36._2_2_ = uVar103;
  auVar36._0_2_ = uVar103;
  fVar308 = (float)((int)sVar64 >> 8);
  fVar313 = (float)(auVar36._0_4_ >> 0x18);
  fVar316 = (float)(auVar186._8_4_ >> 0x18);
  fVar287 = fVar106 * fVar132 + fVar130 * fVar161 + fVar131 * fVar224;
  fVar296 = fVar106 * fVar139 + fVar130 * fVar170 + fVar131 * fVar227;
  fVar300 = fVar106 * fVar140 + fVar130 * fVar171 + fVar131 * fVar229;
  fVar304 = fVar106 * (float)(auVar253._12_4_ >> 0x18) +
            fVar130 * (float)(auVar66._12_4_ >> 0x18) + fVar131 * (float)(auVar68._12_4_ >> 0x18);
  fVar270 = fVar106 * fVar65 + fVar130 * fVar209 + fVar131 * fVar250;
  fVar275 = fVar106 * fVar104 + fVar130 * fVar219 + fVar131 * fVar257;
  fVar279 = fVar106 * fVar105 + fVar130 * fVar221 + fVar131 * fVar259;
  fVar283 = fVar106 * (float)(auVar71._12_4_ >> 0x18) +
            fVar130 * (float)(auVar175._12_4_ >> 0x18) + fVar131 * (float)(auVar178._12_4_ >> 0x18);
  fVar172 = fVar106 * fVar232 + fVar130 * fVar262 + fVar131 * fVar308;
  fVar204 = fVar106 * fVar245 + fVar130 * fVar265 + fVar131 * fVar313;
  fVar206 = fVar106 * fVar247 + fVar130 * fVar267 + fVar131 * fVar316;
  fVar106 = fVar106 * (float)(auVar181._12_4_ >> 0x18) +
            fVar130 * (float)(auVar184._12_4_ >> 0x18) + fVar131 * (float)(auVar187._12_4_ >> 0x18);
  fVar224 = fVar132 * fVar142 + fVar161 * fVar159 + fVar224 * fVar160;
  fVar227 = fVar139 * fVar142 + fVar170 * fVar159 + fVar227 * fVar160;
  fVar229 = fVar140 * fVar142 + fVar171 * fVar159 + fVar229 * fVar160;
  fVar141 = (float)(auVar253._12_4_ >> 0x18) * fVar142 +
            (float)(auVar66._12_4_ >> 0x18) * fVar159 + (float)(auVar68._12_4_ >> 0x18) * fVar160;
  fVar250 = fVar65 * fVar142 + fVar209 * fVar159 + fVar250 * fVar160;
  fVar219 = fVar104 * fVar142 + fVar219 * fVar159 + fVar257 * fVar160;
  fVar221 = fVar105 * fVar142 + fVar221 * fVar159 + fVar259 * fVar160;
  fVar257 = (float)(auVar71._12_4_ >> 0x18) * fVar142 +
            (float)(auVar175._12_4_ >> 0x18) * fVar159 + (float)(auVar178._12_4_ >> 0x18) * fVar160;
  fVar161 = fVar142 * fVar232 + fVar159 * fVar262 + fVar160 * fVar308;
  fVar170 = fVar142 * fVar245 + fVar159 * fVar265 + fVar160 * fVar313;
  fVar171 = fVar142 * fVar247 + fVar159 * fVar267 + fVar160 * fVar316;
  fVar209 = fVar142 * (float)(auVar181._12_4_ >> 0x18) +
            fVar159 * (float)(auVar184._12_4_ >> 0x18) + fVar160 * (float)(auVar187._12_4_ >> 0x18);
  fVar131 = (float)DAT_01f4bd50;
  fVar65 = DAT_01f4bd50._4_4_;
  fVar104 = DAT_01f4bd50._8_4_;
  fVar105 = DAT_01f4bd50._12_4_;
  uVar56 = -(uint)(fVar131 <= ABS(fVar287));
  uVar57 = -(uint)(fVar65 <= ABS(fVar296));
  uVar58 = -(uint)(fVar104 <= ABS(fVar300));
  uVar61 = -(uint)(fVar105 <= ABS(fVar304));
  auVar291._0_4_ = (uint)fVar287 & uVar56;
  auVar291._4_4_ = (uint)fVar296 & uVar57;
  auVar291._8_4_ = (uint)fVar300 & uVar58;
  auVar291._12_4_ = (uint)fVar304 & uVar61;
  auVar143._0_4_ = ~uVar56 & (uint)fVar131;
  auVar143._4_4_ = ~uVar57 & (uint)fVar65;
  auVar143._8_4_ = ~uVar58 & (uint)fVar104;
  auVar143._12_4_ = ~uVar61 & (uint)fVar105;
  auVar143 = auVar143 | auVar291;
  uVar56 = -(uint)(fVar131 <= ABS(fVar270));
  uVar57 = -(uint)(fVar65 <= ABS(fVar275));
  uVar58 = -(uint)(fVar104 <= ABS(fVar279));
  uVar61 = -(uint)(fVar105 <= ABS(fVar283));
  auVar273._0_4_ = (uint)fVar270 & uVar56;
  auVar273._4_4_ = (uint)fVar275 & uVar57;
  auVar273._8_4_ = (uint)fVar279 & uVar58;
  auVar273._12_4_ = (uint)fVar283 & uVar61;
  auVar162._0_4_ = ~uVar56 & (uint)fVar131;
  auVar162._4_4_ = ~uVar57 & (uint)fVar65;
  auVar162._8_4_ = ~uVar58 & (uint)fVar104;
  auVar162._12_4_ = ~uVar61 & (uint)fVar105;
  auVar162 = auVar162 | auVar273;
  uVar56 = -(uint)(fVar131 <= ABS(fVar172));
  uVar57 = -(uint)(fVar65 <= ABS(fVar204));
  uVar58 = -(uint)(fVar104 <= ABS(fVar206));
  uVar61 = -(uint)(fVar105 <= ABS(fVar106));
  auVar189._0_4_ = (uint)fVar172 & uVar56;
  auVar189._4_4_ = (uint)fVar204 & uVar57;
  auVar189._8_4_ = (uint)fVar206 & uVar58;
  auVar189._12_4_ = (uint)fVar106 & uVar61;
  auVar211._0_4_ = ~uVar56 & (uint)fVar131;
  auVar211._4_4_ = ~uVar57 & (uint)fVar65;
  auVar211._8_4_ = ~uVar58 & (uint)fVar104;
  auVar211._12_4_ = ~uVar61 & (uint)fVar105;
  auVar211 = auVar211 | auVar189;
  auVar73 = rcpps(_DAT_01f4bd50,auVar143);
  fVar131 = auVar73._0_4_;
  fVar105 = auVar73._4_4_;
  fVar132 = auVar73._8_4_;
  fVar142 = auVar73._12_4_;
  fVar131 = (1.0 - auVar143._0_4_ * fVar131) * fVar131 + fVar131;
  fVar105 = (1.0 - auVar143._4_4_ * fVar105) * fVar105 + fVar105;
  fVar132 = (1.0 - auVar143._8_4_ * fVar132) * fVar132 + fVar132;
  fVar142 = (1.0 - auVar143._12_4_ * fVar142) * fVar142 + fVar142;
  auVar73 = rcpps(auVar73,auVar162);
  fVar65 = auVar73._0_4_;
  fVar106 = auVar73._4_4_;
  fVar139 = auVar73._8_4_;
  fVar159 = auVar73._12_4_;
  fVar65 = (1.0 - auVar162._0_4_ * fVar65) * fVar65 + fVar65;
  fVar106 = (1.0 - auVar162._4_4_ * fVar106) * fVar106 + fVar106;
  fVar139 = (1.0 - auVar162._8_4_ * fVar139) * fVar139 + fVar139;
  fVar159 = (1.0 - auVar162._12_4_ * fVar159) * fVar159 + fVar159;
  auVar73 = rcpps(auVar73,auVar211);
  fVar104 = auVar73._0_4_;
  fVar130 = auVar73._4_4_;
  fVar140 = auVar73._8_4_;
  fVar160 = auVar73._12_4_;
  fVar104 = (1.0 - auVar211._0_4_ * fVar104) * fVar104 + fVar104;
  fVar130 = (1.0 - auVar211._4_4_ * fVar130) * fVar130 + fVar130;
  fVar140 = (1.0 - auVar211._8_4_ * fVar140) * fVar140 + fVar140;
  fVar160 = (1.0 - auVar211._12_4_ * fVar160) * fVar160 + fVar160;
  uVar54 = *(ulong *)(prim + uVar53 * 7 + 6);
  uVar103 = (undefined2)(uVar54 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar54;
  auVar76._12_2_ = uVar103;
  auVar76._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar54 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar54;
  auVar75._10_2_ = uVar103;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar103;
  auVar74._0_8_ = uVar54;
  uVar103 = (undefined2)(uVar54 >> 0x10);
  auVar37._4_8_ = auVar74._8_8_;
  auVar37._2_2_ = uVar103;
  auVar37._0_2_ = uVar103;
  auVar144._0_8_ =
       CONCAT44(((float)(auVar37._0_4_ >> 0x10) - fVar227) * fVar105,
                ((float)(int)(short)uVar54 - fVar224) * fVar131);
  auVar144._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar229) * fVar132;
  auVar144._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar141) * fVar142;
  uVar54 = *(ulong *)(prim + uVar53 * 9 + 6);
  uVar103 = (undefined2)(uVar54 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar54;
  auVar79._12_2_ = uVar103;
  auVar79._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar54 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar54;
  auVar78._10_2_ = uVar103;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar103;
  auVar77._0_8_ = uVar54;
  uVar103 = (undefined2)(uVar54 >> 0x10);
  auVar38._4_8_ = auVar77._8_8_;
  auVar38._2_2_ = uVar103;
  auVar38._0_2_ = uVar103;
  auVar212._0_4_ = ((float)(int)(short)uVar54 - fVar224) * fVar131;
  auVar212._4_4_ = ((float)(auVar38._0_4_ >> 0x10) - fVar227) * fVar105;
  auVar212._8_4_ = ((float)(auVar77._8_4_ >> 0x10) - fVar229) * fVar132;
  auVar212._12_4_ = ((float)(auVar78._12_4_ >> 0x10) - fVar141) * fVar142;
  uVar54 = *(ulong *)(prim + uVar53 * 0xe + 6);
  uVar103 = (undefined2)(uVar54 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar54;
  auVar82._12_2_ = uVar103;
  auVar82._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar54 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar54;
  auVar81._10_2_ = uVar103;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar103;
  auVar80._0_8_ = uVar54;
  uVar103 = (undefined2)(uVar54 >> 0x10);
  auVar39._4_8_ = auVar80._8_8_;
  auVar39._2_2_ = uVar103;
  auVar39._0_2_ = uVar103;
  auVar133._0_8_ =
       CONCAT44(((float)(auVar39._0_4_ >> 0x10) - fVar219) * fVar106,
                ((float)(int)(short)uVar54 - fVar250) * fVar65);
  auVar133._8_4_ = ((float)(auVar80._8_4_ >> 0x10) - fVar221) * fVar139;
  auVar133._12_4_ = ((float)(auVar81._12_4_ >> 0x10) - fVar257) * fVar159;
  uVar54 = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  uVar103 = (undefined2)(uVar54 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar54;
  auVar85._12_2_ = uVar103;
  auVar85._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar54 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar54;
  auVar84._10_2_ = uVar103;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar103;
  auVar83._0_8_ = uVar54;
  uVar103 = (undefined2)(uVar54 >> 0x10);
  auVar40._4_8_ = auVar83._8_8_;
  auVar40._2_2_ = uVar103;
  auVar40._0_2_ = uVar103;
  auVar86._0_4_ = ((float)(int)(short)uVar54 - fVar250) * fVar65;
  auVar86._4_4_ = ((float)(auVar40._0_4_ >> 0x10) - fVar219) * fVar106;
  auVar86._8_4_ = ((float)(auVar83._8_4_ >> 0x10) - fVar221) * fVar139;
  auVar86._12_4_ = ((float)(auVar84._12_4_ >> 0x10) - fVar257) * fVar159;
  uVar54 = *(ulong *)(prim + uVar53 * 0x15 + 6);
  uVar103 = (undefined2)(uVar54 >> 0x30);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar54;
  auVar192._12_2_ = uVar103;
  auVar192._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar54 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar54;
  auVar191._10_2_ = uVar103;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar103;
  auVar190._0_8_ = uVar54;
  uVar103 = (undefined2)(uVar54 >> 0x10);
  auVar41._4_8_ = auVar190._8_8_;
  auVar41._2_2_ = uVar103;
  auVar41._0_2_ = uVar103;
  auVar193._0_8_ =
       CONCAT44(((float)(auVar41._0_4_ >> 0x10) - fVar170) * fVar130,
                ((float)(int)(short)uVar54 - fVar161) * fVar104);
  auVar193._8_4_ = ((float)(auVar190._8_4_ >> 0x10) - fVar171) * fVar140;
  auVar193._12_4_ = ((float)(auVar191._12_4_ >> 0x10) - fVar209) * fVar160;
  local_2c0 = prim;
  uVar54 = *(ulong *)(prim + uVar53 * 0x17 + 6);
  uVar103 = (undefined2)(uVar54 >> 0x30);
  auVar236._8_4_ = 0;
  auVar236._0_8_ = uVar54;
  auVar236._12_2_ = uVar103;
  auVar236._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar54 >> 0x20);
  auVar235._12_4_ = auVar236._12_4_;
  auVar235._8_2_ = 0;
  auVar235._0_8_ = uVar54;
  auVar235._10_2_ = uVar103;
  auVar234._10_6_ = auVar235._10_6_;
  auVar234._8_2_ = uVar103;
  auVar234._0_8_ = uVar54;
  uVar103 = (undefined2)(uVar54 >> 0x10);
  auVar42._4_8_ = auVar234._8_8_;
  auVar42._2_2_ = uVar103;
  auVar42._0_2_ = uVar103;
  auVar237._0_4_ = ((float)(int)(short)uVar54 - fVar161) * fVar104;
  auVar237._4_4_ = ((float)(auVar42._0_4_ >> 0x10) - fVar170) * fVar130;
  auVar237._8_4_ = ((float)(auVar234._8_4_ >> 0x10) - fVar171) * fVar140;
  auVar237._12_4_ = ((float)(auVar235._12_4_ >> 0x10) - fVar209) * fVar160;
  auVar252._8_4_ = auVar144._8_4_;
  auVar252._0_8_ = auVar144._0_8_;
  auVar252._12_4_ = auVar144._12_4_;
  auVar253 = minps(auVar252,auVar212);
  auVar108._8_4_ = auVar133._8_4_;
  auVar108._0_8_ = auVar133._0_8_;
  auVar108._12_4_ = auVar133._12_4_;
  auVar73 = minps(auVar108,auVar86);
  auVar253 = maxps(auVar253,auVar73);
  auVar109._8_4_ = auVar193._8_4_;
  auVar109._0_8_ = auVar193._0_8_;
  auVar109._12_4_ = auVar193._12_4_;
  auVar73 = minps(auVar109,auVar237);
  uVar46 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar163._4_4_ = uVar46;
  auVar163._0_4_ = uVar46;
  auVar163._8_4_ = uVar46;
  auVar163._12_4_ = uVar46;
  auVar73 = maxps(auVar73,auVar163);
  auVar73 = maxps(auVar253,auVar73);
  fVar65 = auVar73._0_4_ * 0.99999964;
  fVar104 = auVar73._4_4_ * 0.99999964;
  fVar105 = auVar73._8_4_ * 0.99999964;
  fVar106 = auVar73._12_4_ * 0.99999964;
  auVar253 = maxps(auVar144,auVar212);
  auVar73 = maxps(auVar133,auVar86);
  auVar73 = minps(auVar253,auVar73);
  auVar253 = maxps(auVar193,auVar237);
  fVar131 = (ray->super_RayK<1>).tfar;
  auVar87._4_4_ = fVar131;
  auVar87._0_4_ = fVar131;
  auVar87._8_4_ = fVar131;
  auVar87._12_4_ = fVar131;
  auVar253 = minps(auVar253,auVar87);
  auVar73 = minps(auVar73,auVar253);
  auVar110._0_4_ = -(uint)(PVar7 != (Primitive)0x0 && fVar65 <= auVar73._0_4_ * 1.0000004);
  auVar110._4_4_ = -(uint)(1 < (byte)PVar7 && fVar104 <= auVar73._4_4_ * 1.0000004);
  auVar110._8_4_ = -(uint)(2 < (byte)PVar7 && fVar105 <= auVar73._8_4_ * 1.0000004);
  auVar110._12_4_ = -(uint)(3 < (byte)PVar7 && fVar106 <= auVar73._12_4_ * 1.0000004);
  uVar56 = movmskps((int)((ulong)(byte)PVar7 * 0x10),auVar110);
  auVar111._0_12_ = mm_lookupmask_ps._240_12_;
  auVar111._12_4_ = 0;
  local_2c8 = prim + uVar53 * 0x19 + 0x16;
LAB_0029aa23:
  uVar54 = (ulong)uVar56;
  if (uVar54 == 0) {
    return;
  }
  lVar47 = 0;
  if (uVar54 != 0) {
    for (; (uVar56 >> lVar47 & 1) == 0; lVar47 = lVar47 + 1) {
    }
  }
  uVar54 = uVar54 - 1 & uVar54;
  uVar56 = *(uint *)(local_2c0 + lVar47 * 4 + 6);
  lVar47 = lVar47 * 0x40;
  uVar53 = 0;
  if (uVar54 != 0) {
    for (; (uVar54 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
    }
  }
  uVar57 = *(uint *)(local_2c0 + 2);
  pPVar1 = local_2c8 + lVar47;
  if (uVar54 != 0) {
    uVar52 = uVar54 - 1 & uVar54;
    uVar53 = uVar53 << 6;
    if ((uVar52 != 0) && (lVar10 = 0, uVar52 != 0)) {
      for (; (uVar52 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
      }
    }
  }
  pPVar2 = local_2c8 + lVar47 + 0x10;
  pPVar3 = local_2c8 + lVar47 + 0x20;
  pPVar4 = local_2c8 + lVar47 + 0x30;
  fVar131 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar130 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar132 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_2a8 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar139 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_4c8 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar140 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fVar141 = local_2a8 * local_2a8;
  fVar204 = fVar139 * fVar139;
  fVar219 = local_4c8 * local_4c8;
  fVar140 = fVar140 * fVar140;
  fVar142 = fVar141 + fVar204 + fVar219;
  auVar164._0_8_ = CONCAT44(fVar204 + fVar204 + fVar140,fVar142);
  auVar164._8_4_ = fVar219 + fVar204 + fVar219;
  auVar164._12_4_ = fVar140 + fVar204 + fVar140;
  auVar145._8_4_ = auVar164._8_4_;
  auVar145._0_8_ = auVar164._0_8_;
  auVar145._12_4_ = auVar164._12_4_;
  auVar73 = rcpss(auVar145,auVar164);
  local_4d8 = (2.0 - fVar142 * auVar73._0_4_) * auVar73._0_4_ *
              (((*(float *)(pPVar1 + 8) + *(float *)(pPVar2 + 8) + *(float *)(pPVar3 + 8) +
                *(float *)(pPVar4 + 8)) * 0.25 - fVar132) * local_4c8 +
              ((*(float *)(pPVar1 + 4) + *(float *)(pPVar2 + 4) + *(float *)(pPVar3 + 4) +
               *(float *)(pPVar4 + 4)) * 0.25 - fVar130) * fVar139 +
              ((*(float *)pPVar1 + *(float *)pPVar2 + *(float *)pPVar3 + *(float *)pPVar4) * 0.25 -
              fVar131) * local_2a8);
  local_2d8 = ZEXT416((uint)local_4d8);
  fVar131 = local_2a8 * local_4d8 + fVar131;
  fVar130 = fVar139 * local_4d8 + fVar130;
  fVar132 = local_4c8 * local_4d8 + fVar132;
  fVar232 = *(float *)pPVar1 - fVar131;
  fVar245 = *(float *)(pPVar1 + 4) - fVar130;
  fVar247 = *(float *)(pPVar1 + 8) - fVar132;
  fVar250 = *(float *)(pPVar1 + 0xc) - 0.0;
  fVar171 = *(float *)pPVar3 - fVar131;
  fVar209 = *(float *)(pPVar3 + 4) - fVar130;
  fVar224 = *(float *)(pPVar3 + 8) - fVar132;
  fVar227 = *(float *)(pPVar3 + 0xc) - 0.0;
  fVar159 = *(float *)pPVar2 - fVar131;
  fVar160 = *(float *)(pPVar2 + 4) - fVar130;
  fVar161 = *(float *)(pPVar2 + 8) - fVar132;
  fVar170 = *(float *)(pPVar2 + 0xc) - 0.0;
  fVar131 = *(float *)pPVar4 - fVar131;
  fVar130 = *(float *)(pPVar4 + 4) - fVar130;
  fVar132 = *(float *)(pPVar4 + 8) - fVar132;
  fVar229 = *(float *)(pPVar4 + 0xc) - 0.0;
  fVar172 = fVar141 + fVar219 + fVar204;
  fVar206 = fVar141 + fVar219 + fVar204;
  fVar221 = fVar141 + fVar219 + fVar204;
  fVar141 = fVar141 + fVar219 + fVar204;
  local_298 = fVar227;
  fStack_294 = fVar227;
  fStack_290 = fVar227;
  fStack_28c = fVar227;
  fStack_2a4 = local_2a8;
  fStack_2a0 = local_2a8;
  fStack_29c = local_2a8;
  local_2b8 = ABS(fVar172);
  fStack_2b4 = ABS(fVar206);
  fStack_2b0 = ABS(fVar221);
  fStack_2ac = ABS(fVar141);
  pSVar48 = (StackEntry *)0x1;
  local_5ec = 1;
  fVar140 = 0.0;
  fVar142 = 1.0;
  uVar52 = 0;
  fStack_4d4 = local_4d8;
  fStack_4d0 = local_4d8;
  fStack_4cc = local_4d8;
  fStack_4c4 = local_4c8;
  fStack_4c0 = local_4c8;
  fStack_4bc = local_4c8;
  local_498 = fVar232;
  fStack_494 = fVar245;
  fStack_490 = fVar247;
  fStack_48c = fVar250;
  do {
    fVar275 = fVar142 - fVar140;
    fVar219 = fVar275 * 0.0 + fVar140;
    fVar257 = fVar275 * 0.33333334 + fVar140;
    fVar259 = fVar275 * 0.6666667 + fVar140;
    fVar262 = fVar275 * 1.0 + fVar140;
    fVar265 = 1.0 - fVar219;
    fVar267 = 1.0 - fVar257;
    fVar270 = 1.0 - fVar259;
    fVar279 = 1.0 - fVar262;
    fVar271 = fVar159 * fVar265 + fVar171 * fVar219;
    fVar276 = fVar159 * fVar267 + fVar171 * fVar257;
    fVar280 = fVar159 * fVar270 + fVar171 * fVar259;
    fVar284 = fVar159 * fVar279 + fVar171 * fVar262;
    fVar263 = fVar160 * fVar265 + fVar209 * fVar219;
    fVar266 = fVar160 * fVar267 + fVar209 * fVar257;
    fVar268 = fVar160 * fVar270 + fVar209 * fVar259;
    fVar269 = fVar160 * fVar279 + fVar209 * fVar262;
    fVar251 = fVar161 * fVar265 + fVar224 * fVar219;
    fVar258 = fVar161 * fVar267 + fVar224 * fVar257;
    fVar260 = fVar161 * fVar270 + fVar224 * fVar259;
    fVar261 = fVar161 * fVar279 + fVar224 * fVar262;
    fVar204 = fVar170 * fVar265 + local_298 * fVar219;
    fVar228 = fVar170 * fVar267 + fStack_294 * fVar257;
    fVar230 = fVar170 * fVar270 + fStack_290 * fVar259;
    fVar231 = fVar170 * fVar279 + fStack_28c * fVar262;
    fVar283 = (fVar232 * fVar265 + fVar159 * fVar219) * fVar265 + fVar219 * fVar271;
    fVar287 = (fVar232 * fVar267 + fVar159 * fVar257) * fVar267 + fVar257 * fVar276;
    fVar296 = (fVar232 * fVar270 + fVar159 * fVar259) * fVar270 + fVar259 * fVar280;
    fVar300 = (fVar232 * fVar279 + fVar159 * fVar262) * fVar279 + fVar262 * fVar284;
    fVar304 = (fVar245 * fVar265 + fVar160 * fVar219) * fVar265 + fVar219 * fVar263;
    fVar308 = (fVar245 * fVar267 + fVar160 * fVar257) * fVar267 + fVar257 * fVar266;
    fVar313 = (fVar245 * fVar270 + fVar160 * fVar259) * fVar270 + fVar259 * fVar268;
    fVar316 = (fVar245 * fVar279 + fVar160 * fVar262) * fVar279 + fVar262 * fVar269;
    fVar173 = (fVar247 * fVar265 + fVar161 * fVar219) * fVar265 + fVar219 * fVar251;
    fVar205 = (fVar247 * fVar267 + fVar161 * fVar257) * fVar267 + fVar257 * fVar258;
    fVar207 = (fVar247 * fVar270 + fVar161 * fVar259) * fVar270 + fVar259 * fVar260;
    fVar208 = (fVar247 * fVar279 + fVar161 * fVar262) * fVar279 + fVar262 * fVar261;
    fVar210 = (fVar250 * fVar265 + fVar170 * fVar219) * fVar265 + fVar219 * fVar204;
    fVar220 = (fVar250 * fVar267 + fVar170 * fVar257) * fVar267 + fVar257 * fVar228;
    fVar222 = (fVar250 * fVar270 + fVar170 * fVar259) * fVar270 + fVar259 * fVar230;
    fVar223 = (fVar250 * fVar279 + fVar170 * fVar262) * fVar279 + fVar262 * fVar231;
    fVar272 = fVar271 * fVar265 + (fVar171 * fVar265 + fVar131 * fVar219) * fVar219;
    fVar277 = fVar276 * fVar267 + (fVar171 * fVar267 + fVar131 * fVar257) * fVar257;
    fVar281 = fVar280 * fVar270 + (fVar171 * fVar270 + fVar131 * fVar259) * fVar259;
    fVar285 = fVar284 * fVar279 + (fVar171 * fVar279 + fVar131 * fVar262) * fVar262;
    fVar271 = fVar263 * fVar265 + (fVar209 * fVar265 + fVar130 * fVar219) * fVar219;
    fVar276 = fVar266 * fVar267 + (fVar209 * fVar267 + fVar130 * fVar257) * fVar257;
    fVar280 = fVar268 * fVar270 + (fVar209 * fVar270 + fVar130 * fVar259) * fVar259;
    fVar284 = fVar269 * fVar279 + (fVar209 * fVar279 + fVar130 * fVar262) * fVar262;
    fVar263 = fVar251 * fVar265 + (fVar224 * fVar265 + fVar132 * fVar219) * fVar219;
    fVar258 = fVar258 * fVar267 + (fVar224 * fVar267 + fVar132 * fVar257) * fVar257;
    fVar260 = fVar260 * fVar270 + (fVar224 * fVar270 + fVar132 * fVar259) * fVar259;
    fVar266 = fVar261 * fVar279 + (fVar224 * fVar279 + fVar132 * fVar262) * fVar262;
    fVar251 = fVar204 * fVar265 + (local_298 * fVar265 + fVar229 * fVar219) * fVar219;
    fVar228 = fVar228 * fVar267 + (fStack_294 * fVar267 + fVar229 * fVar257) * fVar257;
    fVar230 = fVar230 * fVar270 + (fStack_290 * fVar270 + fVar229 * fVar259) * fVar259;
    fVar231 = fVar231 * fVar279 + (fStack_28c * fVar279 + fVar229 * fVar262) * fVar262;
    fVar309 = fVar265 * fVar283 + fVar219 * fVar272;
    fVar314 = fVar267 * fVar287 + fVar257 * fVar277;
    fVar317 = fVar270 * fVar296 + fVar259 * fVar281;
    fVar318 = fVar279 * fVar300 + fVar262 * fVar285;
    fVar320 = fVar265 * fVar304 + fVar219 * fVar271;
    fVar326 = fVar267 * fVar308 + fVar257 * fVar276;
    fVar327 = fVar270 * fVar313 + fVar259 * fVar280;
    fVar328 = fVar279 * fVar316 + fVar262 * fVar284;
    fVar288 = fVar265 * fVar173 + fVar219 * fVar263;
    fVar297 = fVar267 * fVar205 + fVar257 * fVar258;
    fVar301 = fVar270 * fVar207 + fVar259 * fVar260;
    fVar305 = fVar279 * fVar208 + fVar262 * fVar266;
    fVar204 = fVar275 * 0.11111111;
    fVar265 = fVar265 * fVar210 + fVar219 * fVar251;
    fVar267 = fVar267 * fVar220 + fVar257 * fVar228;
    auVar134._0_8_ = CONCAT44(fVar267,fVar265);
    auVar134._8_4_ = fVar270 * fVar222 + fVar259 * fVar230;
    auVar134._12_4_ = fVar279 * fVar223 + fVar262 * fVar231;
    fVar272 = (fVar272 - fVar283) * 3.0 * fVar204;
    fVar278 = (fVar277 - fVar287) * 3.0 * fVar204;
    fVar282 = (fVar281 - fVar296) * 3.0 * fVar204;
    fVar286 = (fVar285 - fVar300) * 3.0 * fVar204;
    fVar268 = (fVar271 - fVar304) * 3.0 * fVar204;
    fVar269 = (fVar276 - fVar308) * 3.0 * fVar204;
    fVar280 = (fVar280 - fVar313) * 3.0 * fVar204;
    fVar284 = (fVar284 - fVar316) * 3.0 * fVar204;
    fVar263 = (fVar263 - fVar173) * 3.0 * fVar204;
    fVar258 = (fVar258 - fVar205) * 3.0 * fVar204;
    fVar261 = (fVar260 - fVar207) * 3.0 * fVar204;
    fVar271 = (fVar266 - fVar208) * 3.0 * fVar204;
    fVar219 = fVar204 * (fVar228 - fVar220) * 3.0;
    fVar257 = fVar204 * (fVar230 - fVar222) * 3.0;
    fVar259 = fVar204 * (fVar231 - fVar223) * 3.0;
    auVar112._4_4_ = auVar134._8_4_;
    auVar112._0_4_ = fVar267;
    auVar112._8_4_ = auVar134._12_4_;
    auVar112._12_4_ = 0;
    local_5c8._4_4_ = fVar267 + fVar219;
    local_5c8._0_4_ = fVar265 + fVar204 * (fVar251 - fVar210) * 3.0;
    fStack_5c0 = auVar134._8_4_ + fVar257;
    fStack_5bc = auVar134._12_4_ + fVar259;
    auVar113._0_8_ = CONCAT44(auVar134._8_4_ - fVar257,fVar267 - fVar219);
    auVar113._8_4_ = auVar134._12_4_ - fVar259;
    auVar113._12_4_ = 0;
    fVar279 = fVar326 - fVar320;
    fVar283 = fVar327 - fVar326;
    fVar287 = fVar328 - fVar327;
    fVar296 = 0.0 - fVar328;
    local_2e8._0_4_ = fVar297 - fVar288;
    local_2e8._4_4_ = fVar301 - fVar297;
    fStack_2e0 = fVar305 - fVar301;
    fStack_2dc = 0.0 - fVar305;
    fVar262 = fVar268 * (float)local_2e8._0_4_ - fVar263 * fVar279;
    fVar265 = fVar269 * (float)local_2e8._4_4_ - fVar258 * fVar283;
    fVar267 = fVar280 * fStack_2e0 - fVar261 * fVar287;
    fVar270 = fVar284 * fStack_2dc - fVar271 * fVar296;
    fVar300 = fVar314 - fVar309;
    fVar308 = fVar317 - fVar314;
    fVar316 = fVar318 - fVar317;
    fVar205 = 0.0 - fVar318;
    fVar304 = fVar263 * fVar300 - fVar272 * (float)local_2e8._0_4_;
    fVar313 = fVar258 * fVar308 - fVar278 * (float)local_2e8._4_4_;
    fVar173 = fVar261 * fVar316 - fVar282 * fStack_2e0;
    fVar207 = fVar271 * fVar205 - fVar286 * fStack_2dc;
    fVar208 = fVar272 * fVar279 - fVar268 * fVar300;
    fVar210 = fVar278 * fVar283 - fVar269 * fVar308;
    fVar220 = fVar282 * fVar287 - fVar280 * fVar316;
    fVar222 = fVar286 * fVar296 - fVar284 * fVar205;
    auVar88._0_4_ = (float)local_2e8._0_4_ * (float)local_2e8._0_4_;
    auVar88._4_4_ = (float)local_2e8._4_4_ * (float)local_2e8._4_4_;
    auVar88._8_4_ = fStack_2e0 * fStack_2e0;
    auVar88._12_4_ = fStack_2dc * fStack_2dc;
    auVar225._0_4_ = fVar300 * fVar300 + fVar279 * fVar279 + auVar88._0_4_;
    auVar225._4_4_ = fVar308 * fVar308 + fVar283 * fVar283 + auVar88._4_4_;
    auVar225._8_4_ = fVar316 * fVar316 + fVar287 * fVar287 + auVar88._8_4_;
    auVar225._12_4_ = fVar205 * fVar205 + fVar296 * fVar296 + auVar88._12_4_;
    auVar73 = rcpps(auVar88,auVar225);
    fVar204 = auVar73._0_4_;
    fVar219 = auVar73._4_4_;
    fVar257 = auVar73._8_4_;
    fVar259 = auVar73._12_4_;
    fVar204 = (1.0 - fVar204 * auVar225._0_4_) * fVar204 + fVar204;
    fVar219 = (1.0 - fVar219 * auVar225._4_4_) * fVar219 + fVar219;
    fVar257 = (1.0 - fVar257 * auVar225._8_4_) * fVar257 + fVar257;
    fVar259 = (1.0 - fVar259 * auVar225._12_4_) * fVar259 + fVar259;
    fVar223 = (float)local_2e8._0_4_ * fVar269 - fVar279 * fVar258;
    fVar251 = (float)local_2e8._4_4_ * fVar280 - fVar283 * fVar261;
    fVar228 = fStack_2e0 * fVar284 - fVar287 * fVar271;
    fVar230 = fStack_2dc * 0.0 - fVar296 * 0.0;
    fVar231 = fVar300 * fVar258 - (float)local_2e8._0_4_ * fVar278;
    fVar260 = fVar308 * fVar261 - (float)local_2e8._4_4_ * fVar282;
    fVar266 = fVar316 * fVar271 - fStack_2e0 * fVar286;
    fVar276 = fVar205 * 0.0 - fStack_2dc * 0.0;
    fVar277 = fVar279 * fVar278 - fVar300 * fVar269;
    fVar281 = fVar283 * fVar282 - fVar308 * fVar280;
    fVar285 = fVar287 * fVar286 - fVar316 * fVar284;
    fVar329 = fVar296 * 0.0 - fVar205 * 0.0;
    auVar310._0_4_ = fVar231 * fVar231 + fVar277 * fVar277;
    auVar310._4_4_ = fVar260 * fVar260 + fVar281 * fVar281;
    auVar310._8_4_ = fVar266 * fVar266 + fVar285 * fVar285;
    auVar310._12_4_ = fVar276 * fVar276 + fVar329 * fVar329;
    auVar194._0_4_ = (fVar262 * fVar262 + fVar304 * fVar304 + fVar208 * fVar208) * fVar204;
    auVar194._4_4_ = (fVar265 * fVar265 + fVar313 * fVar313 + fVar210 * fVar210) * fVar219;
    auVar194._8_4_ = (fVar267 * fVar267 + fVar173 * fVar173 + fVar220 * fVar220) * fVar257;
    auVar194._12_4_ = (fVar270 * fVar270 + fVar207 * fVar207 + fVar222 * fVar222) * fVar259;
    auVar238._0_4_ = (fVar223 * fVar223 + auVar310._0_4_) * fVar204;
    auVar238._4_4_ = (fVar251 * fVar251 + auVar310._4_4_) * fVar219;
    auVar238._8_4_ = (fVar228 * fVar228 + auVar310._8_4_) * fVar257;
    auVar238._12_4_ = (fVar230 * fVar230 + auVar310._12_4_) * fVar259;
    auVar195 = maxps(auVar194,auVar238);
    auVar213._8_4_ = auVar134._8_4_;
    auVar213._0_8_ = auVar134._0_8_;
    auVar213._12_4_ = auVar134._12_4_;
    auVar73 = maxps(auVar213,_local_5c8);
    auVar239._8_4_ = auVar113._8_4_;
    auVar239._0_8_ = auVar113._0_8_;
    auVar239._12_4_ = 0;
    auVar253 = maxps(auVar239,auVar112);
    auVar214 = maxps(auVar73,auVar253);
    auVar253 = minps(auVar134,_local_5c8);
    auVar73 = minps(auVar113,auVar112);
    auVar253 = minps(auVar253,auVar73);
    auVar73 = sqrtps(auVar73,auVar195);
    auVar195 = rsqrtps(auVar310,auVar225);
    fVar204 = auVar195._0_4_;
    fVar219 = auVar195._4_4_;
    fVar257 = auVar195._8_4_;
    fVar259 = auVar195._12_4_;
    local_2f8._0_4_ = fVar204 * fVar204 * auVar225._0_4_ * -0.5 * fVar204 + fVar204 * 1.5;
    local_2f8._4_4_ = fVar219 * fVar219 * auVar225._4_4_ * -0.5 * fVar219 + fVar219 * 1.5;
    fStack_2f0 = fVar257 * fVar257 * auVar225._8_4_ * -0.5 * fVar257 + fVar257 * 1.5;
    fStack_2ec = fVar259 * fVar259 * auVar225._12_4_ * -0.5 * fVar259 + fVar259 * 1.5;
    fVar223 = 0.0 - fVar320;
    fVar251 = 0.0 - fVar326;
    fVar228 = 0.0 - fVar327;
    fVar230 = 0.0 - fVar328;
    auVar321._0_4_ = 0.0 - fVar288;
    auVar321._4_4_ = 0.0 - fVar297;
    auVar321._8_4_ = 0.0 - fVar301;
    auVar321._12_4_ = 0.0 - fVar305;
    fVar277 = 0.0 - fVar309;
    fVar281 = 0.0 - fVar314;
    fVar285 = 0.0 - fVar317;
    fVar329 = 0.0 - fVar318;
    fVar204 = local_2a8 * fVar300 * (float)local_2f8._0_4_ +
              fVar139 * fVar279 * (float)local_2f8._0_4_ +
              local_4c8 * (float)local_2e8._0_4_ * (float)local_2f8._0_4_;
    fVar257 = fStack_2a4 * fVar308 * (float)local_2f8._4_4_ +
              fVar139 * fVar283 * (float)local_2f8._4_4_ +
              fStack_4c4 * (float)local_2e8._4_4_ * (float)local_2f8._4_4_;
    fVar262 = fStack_2a0 * fVar316 * fStack_2f0 +
              fVar139 * fVar287 * fStack_2f0 + fStack_4c0 * fStack_2e0 * fStack_2f0;
    fVar267 = fStack_29c * fVar205 * fStack_2ec +
              fVar139 * fVar296 * fStack_2ec + fStack_4bc * fStack_2dc * fStack_2ec;
    fVar304 = fVar300 * (float)local_2f8._0_4_ * fVar277 +
              fVar279 * (float)local_2f8._0_4_ * fVar223 +
              (float)local_2e8._0_4_ * (float)local_2f8._0_4_ * auVar321._0_4_;
    fVar313 = fVar308 * (float)local_2f8._4_4_ * fVar281 +
              fVar283 * (float)local_2f8._4_4_ * fVar251 +
              (float)local_2e8._4_4_ * (float)local_2f8._4_4_ * auVar321._4_4_;
    fVar173 = fVar316 * fStack_2f0 * fVar285 +
              fVar287 * fStack_2f0 * fVar228 + fStack_2e0 * fStack_2f0 * auVar321._8_4_;
    fVar207 = fVar205 * fStack_2ec * fVar329 +
              fVar296 * fStack_2ec * fVar230 + fStack_2dc * fStack_2ec * auVar321._12_4_;
    fVar231 = (local_2a8 * fVar277 + fVar139 * fVar223 + local_4c8 * auVar321._0_4_) -
              fVar204 * fVar304;
    fVar260 = (fStack_2a4 * fVar281 + fVar139 * fVar251 + fStack_4c4 * auVar321._4_4_) -
              fVar257 * fVar313;
    fVar266 = (fStack_2a0 * fVar285 + fVar139 * fVar228 + fStack_4c0 * auVar321._8_4_) -
              fVar262 * fVar173;
    fVar276 = (fStack_29c * fVar329 + fVar139 * fVar230 + fStack_4bc * auVar321._12_4_) -
              fVar267 * fVar207;
    fVar219 = (fVar277 * fVar277 + fVar223 * fVar223 + auVar321._0_4_ * auVar321._0_4_) -
              fVar304 * fVar304;
    fVar259 = (fVar281 * fVar281 + fVar251 * fVar251 + auVar321._4_4_ * auVar321._4_4_) -
              fVar313 * fVar313;
    fVar265 = (fVar285 * fVar285 + fVar228 * fVar228 + auVar321._8_4_ * auVar321._8_4_) -
              fVar173 * fVar173;
    fVar270 = (fVar329 * fVar329 + fVar230 * fVar230 + auVar321._12_4_ * auVar321._12_4_) -
              fVar207 * fVar207;
    fVar208 = (auVar214._0_4_ + auVar73._0_4_) * 1.0000002;
    fVar210 = (auVar214._4_4_ + auVar73._4_4_) * 1.0000002;
    fVar220 = (auVar214._8_4_ + auVar73._8_4_) * 1.0000002;
    fVar222 = (auVar214._12_4_ + auVar73._12_4_) * 1.0000002;
    local_318 = fVar219 - fVar208 * fVar208;
    fStack_314 = fVar259 - fVar210 * fVar210;
    fStack_310 = fVar265 - fVar220 * fVar220;
    fStack_30c = fVar270 - fVar222 * fVar222;
    fVar289 = fVar172 - fVar204 * fVar204;
    fVar298 = fVar206 - fVar257 * fVar257;
    fVar302 = fVar221 - fVar262 * fVar262;
    fVar306 = fVar141 - fVar267 * fVar267;
    fVar231 = fVar231 + fVar231;
    fVar260 = fVar260 + fVar260;
    fVar266 = fVar266 + fVar266;
    fVar276 = fVar276 + fVar276;
    auVar114._0_4_ = fVar231 * fVar231 - fVar289 * 4.0 * local_318;
    auVar114._4_4_ = fVar260 * fVar260 - fVar298 * 4.0 * fStack_314;
    auVar114._8_4_ = fVar266 * fVar266 - fVar302 * 4.0 * fStack_310;
    auVar114._12_4_ = fVar276 * fVar276 - fVar306 * 4.0 * fStack_30c;
    auVar196._4_4_ = -(uint)(0.0 <= auVar114._4_4_);
    auVar196._0_4_ = -(uint)(0.0 <= auVar114._0_4_);
    auVar196._8_4_ = -(uint)(0.0 <= auVar114._8_4_);
    auVar196._12_4_ = -(uint)(0.0 <= auVar114._12_4_);
    uVar46 = (undefined4)((ulong)pSVar48 >> 0x20);
    iVar44 = movmskps((int)pSVar48,auVar196);
    local_308._0_4_ = (uint)(fVar204 * fVar204) & (uint)DAT_01f46710;
    local_308._4_4_ = (uint)(fVar257 * fVar257) & DAT_01f46710._4_4_;
    local_308._8_4_ = (uint)(fVar262 * fVar262) & DAT_01f46710._8_4_;
    local_308._12_4_ = (uint)(fVar267 * fVar267) & DAT_01f46710._12_4_;
    fVar208 = (float)((uint)fVar289 & (uint)DAT_01f46710);
    fVar210 = (float)((uint)fVar298 & DAT_01f46710._4_4_);
    fVar220 = (float)((uint)fVar302 & DAT_01f46710._8_4_);
    fVar222 = (float)((uint)fVar306 & DAT_01f46710._12_4_);
    local_4e8 = (undefined1  [8])(CONCAT44(fVar260,fVar231) ^ 0x8000000080000000);
    if (iVar44 == 0) {
      iVar44 = 0;
      auVar241 = _DAT_01f45a40;
      auVar311 = _DAT_01f45a30;
    }
    else {
      auVar214 = sqrtps(auVar321,auVar114);
      bVar55 = 0.0 <= auVar114._0_4_;
      uVar58 = -(uint)bVar55;
      bVar11 = 0.0 <= auVar114._4_4_;
      uVar61 = -(uint)bVar11;
      bVar12 = 0.0 <= auVar114._8_4_;
      uVar59 = -(uint)bVar12;
      bVar13 = 0.0 <= auVar114._12_4_;
      uVar62 = -(uint)bVar13;
      auVar215._0_4_ = fVar289 + fVar289;
      auVar215._4_4_ = fVar298 + fVar298;
      auVar215._8_4_ = fVar302 + fVar302;
      auVar215._12_4_ = fVar306 + fVar306;
      auVar195 = rcpps(_DAT_01f46710,auVar215);
      fVar290 = auVar195._0_4_;
      fVar299 = auVar195._4_4_;
      fVar303 = auVar195._8_4_;
      fVar307 = auVar195._12_4_;
      fVar290 = (1.0 - auVar215._0_4_ * fVar290) * fVar290 + fVar290;
      fVar299 = (1.0 - auVar215._4_4_ * fVar299) * fVar299 + fVar299;
      fVar303 = (1.0 - auVar215._8_4_ * fVar303) * fVar303 + fVar303;
      fVar307 = (1.0 - auVar215._12_4_ * fVar307) * fVar307 + fVar307;
      fVar233 = (-fVar231 - auVar214._0_4_) * fVar290;
      fVar246 = (-fVar260 - auVar214._4_4_) * fVar299;
      fVar248 = (-fVar266 - auVar214._8_4_) * fVar303;
      fVar249 = (-fVar276 - auVar214._12_4_) * fVar307;
      fVar290 = (auVar214._0_4_ - fVar231) * fVar290;
      fVar299 = (auVar214._4_4_ - fVar260) * fVar299;
      fVar303 = (auVar214._8_4_ - fVar266) * fVar303;
      fVar307 = (auVar214._12_4_ - fVar276) * fVar307;
      local_218 = (fVar204 * fVar233 + fVar304) * (float)local_2f8._0_4_;
      fStack_214 = (fVar257 * fVar246 + fVar313) * (float)local_2f8._4_4_;
      fStack_210 = (fVar262 * fVar248 + fVar173) * fStack_2f0;
      fStack_20c = (fVar267 * fVar249 + fVar207) * fStack_2ec;
      local_208 = (fVar204 * fVar290 + fVar304) * (float)local_2f8._0_4_;
      fStack_204 = (fVar257 * fVar299 + fVar313) * (float)local_2f8._4_4_;
      fStack_200 = (fVar262 * fVar303 + fVar173) * fStack_2f0;
      fStack_1fc = (fVar267 * fVar307 + fVar207) * fStack_2ec;
      auVar240._0_4_ = (uint)fVar233 & uVar58;
      auVar240._4_4_ = (uint)fVar246 & uVar61;
      auVar240._8_4_ = (uint)fVar248 & uVar59;
      auVar240._12_4_ = (uint)fVar249 & uVar62;
      auVar311._0_8_ = CONCAT44(~uVar61,~uVar58) & 0x7f8000007f800000;
      auVar311._8_4_ = ~uVar59 & 0x7f800000;
      auVar311._12_4_ = ~uVar62 & 0x7f800000;
      auVar311 = auVar311 | auVar240;
      auVar322._0_4_ = (uint)fVar290 & uVar58;
      auVar322._4_4_ = (uint)fVar299 & uVar61;
      auVar322._8_4_ = (uint)fVar303 & uVar59;
      auVar322._12_4_ = (uint)fVar307 & uVar62;
      auVar241._0_8_ = CONCAT44(~uVar61,~uVar58) & 0xff800000ff800000;
      auVar241._8_4_ = ~uVar59 & 0xff800000;
      auVar241._12_4_ = ~uVar62 & 0xff800000;
      auVar241 = auVar241 | auVar322;
      auVar23._4_4_ = fStack_2b4;
      auVar23._0_4_ = local_2b8;
      auVar23._8_4_ = fStack_2b0;
      auVar23._12_4_ = fStack_2ac;
      auVar195 = maxps(auVar23,local_308);
      fVar290 = auVar195._0_4_ * 1.9073486e-06;
      fVar299 = auVar195._4_4_ * 1.9073486e-06;
      fVar303 = auVar195._8_4_ * 1.9073486e-06;
      fVar307 = auVar195._12_4_ * 1.9073486e-06;
      auVar323._0_4_ = -(uint)(fVar208 < fVar290 && bVar55);
      auVar323._4_4_ = -(uint)(fVar210 < fVar299 && bVar11);
      auVar323._8_4_ = -(uint)(fVar220 < fVar303 && bVar12);
      auVar323._12_4_ = -(uint)(fVar222 < fVar307 && bVar13);
      iVar44 = movmskps(iVar44,auVar323);
      if (iVar44 != 0) {
        uVar58 = -(uint)(local_318 <= 0.0);
        uVar61 = -(uint)(fStack_314 <= 0.0);
        uVar59 = -(uint)(fStack_310 <= 0.0);
        uVar62 = -(uint)(fStack_30c <= 0.0);
        auVar203._0_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar323._0_4_;
        auVar203._4_4_ = (uVar61 & 0xff800000 | ~uVar61 & 0x7f800000) & auVar323._4_4_;
        auVar203._8_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar323._8_4_;
        auVar203._12_4_ = (uVar62 & 0xff800000 | ~uVar62 & 0x7f800000) & auVar323._12_4_;
        auVar295._0_4_ = ~auVar323._0_4_ & auVar311._0_4_;
        auVar295._4_4_ = ~auVar323._4_4_ & auVar311._4_4_;
        auVar295._8_4_ = ~auVar323._8_4_ & auVar311._8_4_;
        auVar295._12_4_ = ~auVar323._12_4_ & auVar311._12_4_;
        auVar311 = auVar295 | auVar203;
        auVar312._0_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar323._0_4_;
        auVar312._4_4_ = (uVar61 & 0x7f800000 | ~uVar61 & 0xff800000) & auVar323._4_4_;
        auVar312._8_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar323._8_4_;
        auVar312._12_4_ = (uVar62 & 0x7f800000 | ~uVar62 & 0xff800000) & auVar323._12_4_;
        auVar325._0_4_ = ~auVar323._0_4_ & auVar241._0_4_;
        auVar325._4_4_ = ~auVar323._4_4_ & auVar241._4_4_;
        auVar325._8_4_ = ~auVar323._8_4_ & auVar241._8_4_;
        auVar325._12_4_ = ~auVar323._12_4_ & auVar241._12_4_;
        auVar241 = auVar325 | auVar312;
        auVar196._4_4_ = -(uint)((fVar299 <= fVar210 || fStack_314 <= 0.0) && bVar11);
        auVar196._0_4_ = -(uint)((fVar290 <= fVar208 || local_318 <= 0.0) && bVar55);
        auVar196._8_4_ = -(uint)((fVar303 <= fVar220 || fStack_310 <= 0.0) && bVar12);
        auVar196._12_4_ = -(uint)((fVar307 <= fVar222 || fStack_30c <= 0.0) && bVar13);
      }
    }
    auVar197._0_4_ = (auVar196._0_4_ << 0x1f) >> 0x1f;
    auVar197._4_4_ = (auVar196._4_4_ << 0x1f) >> 0x1f;
    auVar197._8_4_ = (auVar196._8_4_ << 0x1f) >> 0x1f;
    auVar197._12_4_ = (auVar196._12_4_ << 0x1f) >> 0x1f;
    auVar197 = auVar197 & auVar111;
    iVar44 = movmskps(iVar44,auVar197);
    pRVar50 = (RTCRayN *)CONCAT44(uVar46,iVar44);
    if (iVar44 != 0) {
      local_318 = fVar204;
      fStack_314 = fVar257;
      fStack_310 = fVar262;
      fStack_30c = fVar267;
      auVar89._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_2d8._0_4_;
      auVar89._4_4_ = auVar89._0_4_;
      auVar89._8_4_ = auVar89._0_4_;
      auVar89._12_4_ = auVar89._0_4_;
      auVar195 = maxps(auVar89,auVar311);
      auVar292._0_4_ = (ray->super_RayK<1>).tfar - (float)local_2d8._0_4_;
      auVar292._4_4_ = auVar292._0_4_;
      auVar292._8_4_ = auVar292._0_4_;
      auVar292._12_4_ = auVar292._0_4_;
      auVar293 = minps(auVar292,auVar241);
      auVar115._0_4_ = fVar268 * fVar139 + fVar263 * local_4c8;
      auVar115._4_4_ = fVar269 * fVar139 + fVar258 * fStack_4c4;
      auVar115._8_4_ = fVar280 * fVar139 + fVar261 * fStack_4c0;
      auVar115._12_4_ = fVar284 * fVar139 + fVar271 * fStack_4bc;
      auVar254._0_4_ = fVar272 * local_2a8 + auVar115._0_4_;
      auVar254._4_4_ = fVar278 * fStack_2a4 + auVar115._4_4_;
      auVar254._8_4_ = fVar282 * fStack_2a0 + auVar115._8_4_;
      auVar254._12_4_ = fVar286 * fStack_29c + auVar115._12_4_;
      auVar214 = rcpps(auVar115,auVar254);
      fVar290 = auVar214._0_4_;
      fVar299 = auVar214._4_4_;
      fVar303 = auVar214._8_4_;
      fVar307 = auVar214._12_4_;
      fVar223 = ((1.0 - auVar254._0_4_ * fVar290) * fVar290 + fVar290) *
                -(fVar277 * fVar272 + fVar223 * fVar268 + auVar321._0_4_ * fVar263);
      fVar251 = ((1.0 - auVar254._4_4_ * fVar299) * fVar299 + fVar299) *
                -(fVar281 * fVar278 + fVar251 * fVar269 + auVar321._4_4_ * fVar258);
      fVar228 = ((1.0 - auVar254._8_4_ * fVar303) * fVar303 + fVar303) *
                -(fVar285 * fVar282 + fVar228 * fVar280 + auVar321._8_4_ * fVar261);
      fVar230 = ((1.0 - auVar254._12_4_ * fVar307) * fVar307 + fVar307) *
                -(fVar329 * fVar286 + fVar230 * fVar284 + auVar321._12_4_ * fVar271);
      uVar58 = -(uint)(auVar254._0_4_ < 0.0 || ABS(auVar254._0_4_) < 1e-18);
      uVar61 = -(uint)(auVar254._4_4_ < 0.0 || ABS(auVar254._4_4_) < 1e-18);
      uVar59 = -(uint)(auVar254._8_4_ < 0.0 || ABS(auVar254._8_4_) < 1e-18);
      uVar62 = -(uint)(auVar254._12_4_ < 0.0 || ABS(auVar254._12_4_) < 1e-18);
      auVar146._0_8_ = CONCAT44(uVar61,uVar58) & 0xff800000ff800000;
      auVar146._8_4_ = uVar59 & 0xff800000;
      auVar146._12_4_ = uVar62 & 0xff800000;
      auVar116._0_4_ = ~uVar58 & (uint)fVar223;
      auVar116._4_4_ = ~uVar61 & (uint)fVar251;
      auVar116._8_4_ = ~uVar59 & (uint)fVar228;
      auVar116._12_4_ = ~uVar62 & (uint)fVar230;
      auVar195 = maxps(auVar195,auVar116 | auVar146);
      uVar61 = -(uint)(0.0 < auVar254._0_4_ || ABS(auVar254._0_4_) < 1e-18);
      uVar59 = -(uint)(0.0 < auVar254._4_4_ || ABS(auVar254._4_4_) < 1e-18);
      uVar60 = -(uint)(0.0 < auVar254._8_4_ || ABS(auVar254._8_4_) < 1e-18);
      uVar63 = -(uint)(0.0 < auVar254._12_4_ || ABS(auVar254._12_4_) < 1e-18);
      uVar315 = DAT_01f45a30._4_4_;
      uVar319 = DAT_01f45a30._12_4_;
      uVar58 = (uint)DAT_01f45a30;
      auVar117._0_4_ = uVar58 & uVar61;
      auVar117._4_4_ = uVar315 & uVar59;
      uVar62 = DAT_01f45a30._8_4_;
      auVar117._8_4_ = uVar62 & uVar60;
      auVar117._12_4_ = uVar319 & uVar63;
      auVar255._0_4_ = ~uVar61 & (uint)fVar223;
      auVar255._4_4_ = ~uVar59 & (uint)fVar251;
      auVar255._8_4_ = ~uVar60 & (uint)fVar228;
      auVar255._12_4_ = ~uVar63 & (uint)fVar230;
      auVar293 = minps(auVar293,auVar255 | auVar117);
      auVar147._0_4_ = (0.0 - fVar326) * -fVar269 + (0.0 - fVar297) * -fVar258;
      auVar147._4_4_ = (0.0 - fVar327) * -fVar280 + (0.0 - fVar301) * -fVar261;
      auVar147._8_4_ = (0.0 - fVar328) * -fVar284 + (0.0 - fVar305) * -fVar271;
      auVar147._12_4_ = 0x80000000;
      auVar330._0_4_ = -fVar278 * local_2a8 + -fVar269 * fVar139 + -fVar258 * local_4c8;
      auVar330._4_4_ = -fVar282 * fStack_2a4 + -fVar280 * fVar139 + -fVar261 * fStack_4c4;
      auVar330._8_4_ = -fVar286 * fStack_2a0 + -fVar284 * fVar139 + -fVar271 * fStack_4c0;
      auVar330._12_4_ = fStack_29c * -0.0 + fVar139 * -0.0 + fStack_4bc * -0.0;
      auVar214 = rcpps(auVar147,auVar330);
      fVar223 = auVar214._0_4_;
      fVar251 = auVar214._4_4_;
      fVar228 = auVar214._8_4_;
      fVar230 = auVar214._12_4_;
      fVar223 = (((float)DAT_01f46a60 - auVar330._0_4_ * fVar223) * fVar223 + fVar223) *
                -((0.0 - fVar314) * -fVar278 + auVar147._0_4_);
      fVar251 = ((DAT_01f46a60._4_4_ - auVar330._4_4_ * fVar251) * fVar251 + fVar251) *
                -((0.0 - fVar317) * -fVar282 + auVar147._4_4_);
      fVar228 = ((DAT_01f46a60._8_4_ - auVar330._8_4_ * fVar228) * fVar228 + fVar228) *
                -((0.0 - fVar318) * -fVar286 + auVar147._8_4_);
      fVar230 = ((DAT_01f46a60._12_4_ - auVar330._12_4_ * fVar230) * fVar230 + fVar230) * 0.0;
      uVar61 = -(uint)(auVar330._0_4_ < 0.0 || ABS(auVar330._0_4_) < 1e-18);
      uVar59 = -(uint)(auVar330._4_4_ < 0.0 || ABS(auVar330._4_4_) < 1e-18);
      uVar60 = -(uint)(auVar330._8_4_ < 0.0 || ABS(auVar330._8_4_) < 1e-18);
      uVar63 = -(uint)(auVar330._12_4_ < 0.0 || ABS(auVar330._12_4_) < 1e-18);
      auVar148._0_8_ = CONCAT44(uVar59,uVar61) & 0xff800000ff800000;
      auVar148._8_4_ = uVar60 & 0xff800000;
      auVar148._12_4_ = uVar63 & 0xff800000;
      auVar118._0_4_ = ~uVar61 & (uint)fVar223;
      auVar118._4_4_ = ~uVar59 & (uint)fVar251;
      auVar118._8_4_ = ~uVar60 & (uint)fVar228;
      auVar118._12_4_ = ~uVar63 & (uint)fVar230;
      auVar195 = maxps(auVar195,auVar118 | auVar148);
      uVar61 = -(uint)(0.0 < auVar330._0_4_ || ABS(auVar330._0_4_) < 1e-18);
      uVar59 = -(uint)(0.0 < auVar330._4_4_ || ABS(auVar330._4_4_) < 1e-18);
      uVar60 = -(uint)(0.0 < auVar330._8_4_ || ABS(auVar330._8_4_) < 1e-18);
      uVar63 = -(uint)(0.0 < auVar330._12_4_ || ABS(auVar330._12_4_) < 1e-18);
      auVar119._0_4_ = uVar58 & uVar61;
      auVar119._4_4_ = uVar315 & uVar59;
      auVar119._8_4_ = uVar62 & uVar60;
      auVar119._12_4_ = uVar319 & uVar63;
      auVar331._0_4_ = ~uVar61 & (uint)fVar223;
      auVar331._4_4_ = ~uVar59 & (uint)fVar251;
      auVar331._8_4_ = ~uVar60 & (uint)fVar228;
      auVar331._12_4_ = ~uVar63 & (uint)fVar230;
      tp1.upper.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar293,auVar331 | auVar119);
      fVar223 = auVar195._12_4_;
      fVar251 = auVar195._0_4_;
      fVar228 = auVar195._4_4_;
      fVar230 = auVar195._8_4_;
      auVar324._0_4_ = -(uint)(fVar251 <= tp1.upper.field_0._0_4_) & auVar197._0_4_;
      auVar324._4_4_ = -(uint)(fVar228 <= tp1.upper.field_0._4_4_) & auVar197._4_4_;
      auVar324._8_4_ = -(uint)(fVar230 <= tp1.upper.field_0._8_4_) & auVar197._8_4_;
      auVar324._12_4_ = -(uint)(fVar223 <= tp1.upper.field_0._12_4_) & auVar197._12_4_;
      iVar44 = movmskps(iVar44,auVar324);
      pRVar50 = (RTCRayN *)CONCAT44(uVar46,iVar44);
      if (iVar44 != 0) {
        auVar16._4_4_ = (auVar253._4_4_ - auVar73._4_4_) * 0.99999976;
        auVar16._0_4_ = (auVar253._0_4_ - auVar73._0_4_) * 0.99999976;
        auVar16._8_4_ = (auVar253._8_4_ - auVar73._8_4_) * 0.99999976;
        auVar16._12_4_ = (auVar253._12_4_ - auVar73._12_4_) * 0.99999976;
        auVar253 = maxps(ZEXT816(0),auVar16);
        auVar25._4_4_ = fStack_214;
        auVar25._0_4_ = local_218;
        auVar25._8_4_ = fStack_210;
        auVar25._12_4_ = fStack_20c;
        auVar73 = minps(auVar25,_DAT_01f46a60);
        auVar165._0_12_ = ZEXT812(0);
        auVar165._12_4_ = 0.0;
        auVar214 = maxps(auVar73,auVar165);
        auVar26._4_4_ = fStack_204;
        auVar26._0_4_ = local_208;
        auVar26._8_4_ = fStack_200;
        auVar26._12_4_ = fStack_1fc;
        auVar73 = minps(auVar26,_DAT_01f46a60);
        auVar73 = maxps(auVar73,auVar165);
        local_108._0_4_ = (auVar214._0_4_ + 0.0) * 0.25 * fVar275 + fVar140;
        local_108._4_4_ = (auVar214._4_4_ + 1.0) * 0.25 * fVar275 + fVar140;
        local_108._8_4_ = (auVar214._8_4_ + 2.0) * 0.25 * fVar275 + fVar140;
        local_108._12_4_ = (auVar214._12_4_ + 3.0) * 0.25 * fVar275 + fVar140;
        local_118[0] = (auVar73._0_4_ + 0.0) * 0.25 * fVar275 + fVar140;
        local_118[1] = (auVar73._4_4_ + 1.0) * 0.25 * fVar275 + fVar140;
        local_118[2] = (auVar73._8_4_ + 2.0) * 0.25 * fVar275 + fVar140;
        local_118[3] = (auVar73._12_4_ + 3.0) * 0.25 * fVar275 + fVar140;
        fVar219 = fVar219 - auVar253._0_4_ * auVar253._0_4_;
        fVar259 = fVar259 - auVar253._4_4_ * auVar253._4_4_;
        fVar265 = fVar265 - auVar253._8_4_ * auVar253._8_4_;
        fVar270 = fVar270 - auVar253._12_4_ * auVar253._12_4_;
        auVar135._0_4_ = fVar289 * 4.0 * fVar219;
        auVar135._4_4_ = fVar298 * 4.0 * fVar259;
        auVar135._8_4_ = fVar302 * 4.0 * fVar265;
        auVar135._12_4_ = fVar306 * 4.0 * fVar270;
        auVar120._0_4_ = fVar231 * fVar231 - auVar135._0_4_;
        auVar120._4_4_ = fVar260 * fVar260 - auVar135._4_4_;
        auVar120._8_4_ = fVar266 * fVar266 - auVar135._8_4_;
        auVar120._12_4_ = fVar276 * fVar276 - auVar135._12_4_;
        auVar274._4_4_ = -(uint)(0.0 <= auVar120._4_4_);
        auVar274._0_4_ = -(uint)(0.0 <= auVar120._0_4_);
        auVar274._8_4_ = -(uint)(0.0 <= auVar120._8_4_);
        auVar274._12_4_ = -(uint)(0.0 <= auVar120._12_4_);
        iVar44 = movmskps(iVar44,auVar274);
        if (iVar44 == 0) {
          _local_5a8 = ZEXT816(0);
          fVar204 = 0.0;
          fVar257 = 0.0;
          fVar262 = 0.0;
          fVar267 = 0.0;
          fVar260 = 0.0;
          fVar261 = 0.0;
          fVar266 = 0.0;
          fVar271 = 0.0;
          fVar275 = 0.0;
          fVar231 = 0.0;
          fVar263 = 0.0;
          fVar258 = 0.0;
          _local_4e8 = ZEXT816(0);
          iVar44 = 0;
          auVar226 = _DAT_01f45a40;
          auVar242 = _DAT_01f45a30;
        }
        else {
          auVar253 = sqrtps(local_108,auVar120);
          auVar90._0_4_ = fVar289 + fVar289;
          auVar90._4_4_ = fVar298 + fVar298;
          auVar90._8_4_ = fVar302 + fVar302;
          auVar90._12_4_ = fVar306 + fVar306;
          auVar73 = rcpps(auVar135,auVar90);
          fVar268 = auVar73._0_4_;
          fVar269 = auVar73._4_4_;
          fVar280 = auVar73._8_4_;
          fVar284 = auVar73._12_4_;
          fVar268 = ((float)DAT_01f46a60 - auVar90._0_4_ * fVar268) * fVar268 + fVar268;
          fVar269 = (DAT_01f46a60._4_4_ - auVar90._4_4_ * fVar269) * fVar269 + fVar269;
          fVar280 = (DAT_01f46a60._8_4_ - auVar90._8_4_ * fVar280) * fVar280 + fVar280;
          fVar284 = (DAT_01f46a60._12_4_ - auVar90._12_4_ * fVar284) * fVar284 + fVar284;
          fVar281 = ((float)local_4e8._0_4_ - auVar253._0_4_) * fVar268;
          fVar282 = ((float)local_4e8._4_4_ - auVar253._4_4_) * fVar269;
          fVar285 = (-fVar266 - auVar253._8_4_) * fVar280;
          fVar286 = (-fVar276 - auVar253._12_4_) * fVar284;
          fVar268 = (auVar253._0_4_ - fVar231) * fVar268;
          fVar269 = (auVar253._4_4_ - fVar260) * fVar269;
          fVar280 = (auVar253._8_4_ - fVar266) * fVar280;
          fVar284 = (auVar253._12_4_ - fVar276) * fVar284;
          fVar276 = (fVar204 * fVar281 + fVar304) * (float)local_2f8._0_4_;
          fVar272 = (fVar257 * fVar282 + fVar313) * (float)local_2f8._4_4_;
          fVar277 = (fVar262 * fVar285 + fVar173) * fStack_2f0;
          fVar278 = (fVar267 * fVar286 + fVar207) * fStack_2ec;
          fVar260 = local_2a8 * fVar281 - (fVar300 * fVar276 + fVar309);
          fVar261 = fStack_2a4 * fVar282 - (fVar308 * fVar272 + fVar314);
          fVar266 = fStack_2a0 * fVar285 - (fVar316 * fVar277 + fVar317);
          fVar271 = fStack_29c * fVar286 - (fVar205 * fVar278 + fVar318);
          fVar275 = fVar139 * fVar281 - (fVar279 * fVar276 + fVar320);
          fVar231 = fVar139 * fVar282 - (fVar283 * fVar272 + fVar326);
          fVar263 = fVar139 * fVar285 - (fVar287 * fVar277 + fVar327);
          fVar258 = fVar139 * fVar286 - (fVar296 * fVar278 + fVar328);
          local_4e8._4_4_ = fStack_4c4 * fVar282 - (fVar272 * (float)local_2e8._4_4_ + fVar297);
          local_4e8._0_4_ = local_4c8 * fVar281 - (fVar276 * (float)local_2e8._0_4_ + fVar288);
          fStack_4e0 = fStack_4c0 * fVar285 - (fVar277 * fStack_2e0 + fVar301);
          fStack_4dc = fStack_4bc * fVar286 - (fVar278 * fStack_2dc + fVar305);
          local_2f8._0_4_ = (fVar204 * fVar268 + fVar304) * (float)local_2f8._0_4_;
          local_2f8._4_4_ = (fVar257 * fVar269 + fVar313) * (float)local_2f8._4_4_;
          fStack_2f0 = (fVar262 * fVar280 + fVar173) * fStack_2f0;
          fStack_2ec = (fVar267 * fVar284 + fVar207) * fStack_2ec;
          local_5a8._4_4_ = fStack_2a4 * fVar269 - (fVar308 * (float)local_2f8._4_4_ + fVar314);
          local_5a8._0_4_ = local_2a8 * fVar268 - (fVar300 * (float)local_2f8._0_4_ + fVar309);
          fStack_5a0 = fStack_2a0 * fVar280 - (fVar316 * fStack_2f0 + fVar317);
          fStack_59c = fStack_29c * fVar284 - (fVar205 * fStack_2ec + fVar318);
          auVar165._0_4_ = fVar139 * fVar268 - (fVar279 * (float)local_2f8._0_4_ + fVar320);
          auVar165._4_4_ = fVar139 * fVar269 - (fVar283 * (float)local_2f8._4_4_ + fVar326);
          auVar165._8_4_ = fVar139 * fVar280 - (fVar287 * fStack_2f0 + fVar327);
          auVar165._12_4_ = fVar139 * fVar284 - (fVar296 * fStack_2ec + fVar328);
          bVar55 = 0.0 <= auVar120._0_4_;
          uVar61 = -(uint)bVar55;
          bVar11 = 0.0 <= auVar120._4_4_;
          uVar59 = -(uint)bVar11;
          bVar12 = 0.0 <= auVar120._8_4_;
          uVar60 = -(uint)bVar12;
          bVar13 = 0.0 <= auVar120._12_4_;
          uVar63 = -(uint)bVar13;
          fVar204 = local_4c8 * fVar268 -
                    ((float)local_2f8._0_4_ * (float)local_2e8._0_4_ + fVar288);
          fVar257 = fStack_4c4 * fVar269 -
                    ((float)local_2f8._4_4_ * (float)local_2e8._4_4_ + fVar297);
          fVar262 = fStack_4c0 * fVar280 - (fStack_2f0 * fStack_2e0 + fVar301);
          fVar267 = fStack_4bc * fVar284 - (fStack_2ec * fStack_2dc + fVar305);
          auVar294._0_4_ = (uint)fVar281 & uVar61;
          auVar294._4_4_ = (uint)fVar282 & uVar59;
          auVar294._8_4_ = (uint)fVar285 & uVar60;
          auVar294._12_4_ = (uint)fVar286 & uVar63;
          auVar242._0_8_ = CONCAT44(~uVar59,~uVar61) & 0x7f8000007f800000;
          auVar242._8_4_ = ~uVar60 & 0x7f800000;
          auVar242._12_4_ = ~uVar63 & 0x7f800000;
          auVar242 = auVar242 | auVar294;
          auVar216._0_4_ = (uint)fVar268 & uVar61;
          auVar216._4_4_ = (uint)fVar269 & uVar59;
          auVar216._8_4_ = (uint)fVar280 & uVar60;
          auVar216._12_4_ = (uint)fVar284 & uVar63;
          auVar226._0_8_ = CONCAT44(~uVar59,~uVar61) & 0xff800000ff800000;
          auVar226._8_4_ = ~uVar60 & 0xff800000;
          auVar226._12_4_ = ~uVar63 & 0xff800000;
          auVar226 = auVar226 | auVar216;
          auVar24._4_4_ = fStack_2b4;
          auVar24._0_4_ = local_2b8;
          auVar24._8_4_ = fStack_2b0;
          auVar24._12_4_ = fStack_2ac;
          auVar73 = maxps(auVar24,local_308);
          fVar279 = auVar73._0_4_ * 1.9073486e-06;
          fVar283 = auVar73._4_4_ * 1.9073486e-06;
          fVar287 = auVar73._8_4_ * 1.9073486e-06;
          fVar296 = auVar73._12_4_ * 1.9073486e-06;
          auVar217._0_4_ = -(uint)(fVar208 < fVar279 && bVar55);
          auVar217._4_4_ = -(uint)(fVar210 < fVar283 && bVar11);
          auVar217._8_4_ = -(uint)(fVar220 < fVar287 && bVar12);
          auVar217._12_4_ = -(uint)(fVar222 < fVar296 && bVar13);
          iVar44 = movmskps(iVar44,auVar217);
          if (iVar44 != 0) {
            uVar61 = -(uint)(fVar219 <= 0.0);
            uVar59 = -(uint)(fVar259 <= 0.0);
            uVar60 = -(uint)(fVar265 <= 0.0);
            uVar63 = -(uint)(fVar270 <= 0.0);
            auVar256._0_4_ = (uVar61 & 0xff800000 | ~uVar61 & uVar58) & auVar217._0_4_;
            auVar256._4_4_ = (uVar59 & 0xff800000 | ~uVar59 & uVar315) & auVar217._4_4_;
            auVar256._8_4_ = (uVar60 & 0xff800000 | ~uVar60 & uVar62) & auVar217._8_4_;
            auVar256._12_4_ = (uVar63 & 0xff800000 | ~uVar63 & uVar319) & auVar217._12_4_;
            auVar264._0_4_ = ~auVar217._0_4_ & auVar242._0_4_;
            auVar264._4_4_ = ~auVar217._4_4_ & auVar242._4_4_;
            auVar264._8_4_ = ~auVar217._8_4_ & auVar242._8_4_;
            auVar264._12_4_ = ~auVar217._12_4_ & auVar242._12_4_;
            auVar242 = auVar264 | auVar256;
            auVar244._0_4_ = (uVar61 & uVar58 | ~uVar61 & 0xff800000) & auVar217._0_4_;
            auVar244._4_4_ = (uVar59 & uVar315 | ~uVar59 & 0xff800000) & auVar217._4_4_;
            auVar244._8_4_ = (uVar60 & uVar62 | ~uVar60 & 0xff800000) & auVar217._8_4_;
            auVar244._12_4_ = (uVar63 & uVar319 | ~uVar63 & 0xff800000) & auVar217._12_4_;
            auVar218._0_4_ = ~auVar217._0_4_ & auVar226._0_4_;
            auVar218._4_4_ = ~auVar217._4_4_ & auVar226._4_4_;
            auVar218._8_4_ = ~auVar217._8_4_ & auVar226._8_4_;
            auVar218._12_4_ = ~auVar217._12_4_ & auVar226._12_4_;
            auVar226 = auVar218 | auVar244;
            auVar274._4_4_ = -(uint)((fVar283 <= fVar210 || fVar259 <= 0.0) && bVar11);
            auVar274._0_4_ = -(uint)((fVar279 <= fVar208 || fVar219 <= 0.0) && bVar55);
            auVar274._8_4_ = -(uint)((fVar287 <= fVar220 || fVar265 <= 0.0) && bVar12);
            auVar274._12_4_ = -(uint)((fVar296 <= fVar222 || fVar270 <= 0.0) && bVar13);
          }
        }
        fVar219 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar259 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar265 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar73 = minps((undefined1  [16])tp1.upper.field_0,auVar242);
        aVar243 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar195,auVar226);
        tp1.lower.field_0 = aVar243;
        local_2f8._0_4_ = -(uint)(fVar251 <= auVar73._0_4_) & auVar324._0_4_;
        local_2f8._4_4_ = -(uint)(fVar228 <= auVar73._4_4_) & auVar324._4_4_;
        fStack_2f0 = (float)(-(uint)(fVar230 <= auVar73._8_4_) & auVar324._8_4_);
        fStack_2ec = (float)(-(uint)(fVar223 <= auVar73._12_4_) & auVar324._12_4_);
        local_2e8 = (undefined1  [8])
                    CONCAT44(-(uint)(aVar243.v[1] <= tp1.upper.field_0._4_4_) & auVar324._4_4_,
                             -(uint)(aVar243.v[0] <= tp1.upper.field_0._0_4_) & auVar324._0_4_);
        fStack_2e0 = (float)(-(uint)(aVar243.v[2] <= tp1.upper.field_0._8_4_) & auVar324._8_4_);
        fStack_2dc = (float)(-(uint)(aVar243.v[3] <= tp1.upper.field_0._12_4_) & auVar324._12_4_);
        auVar91._8_4_ = fStack_2e0;
        auVar91._0_8_ = local_2e8;
        auVar91._12_4_ = fStack_2dc;
        iVar44 = movmskps(iVar44,auVar91 | _local_2f8);
        pRVar50 = (RTCRayN *)CONCAT44(uVar46,iVar44);
        if (iVar44 != 0) {
          local_308._4_4_ = local_5ec;
          local_308._0_4_ = local_5ec;
          local_308._8_4_ = local_5ec;
          local_308._12_4_ = local_5ec;
          local_4e8._0_4_ =
               -(uint)((int)local_5ec <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4e8._0_4_ * fVar265 +
                                                 fVar275 * fVar259 + fVar260 * fVar219)) &
                             auVar274._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4e8._4_4_ =
               -(uint)((int)local_5ec <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4e8._4_4_ * fVar265 +
                                                 fVar231 * fVar259 + fVar261 * fVar219)) &
                             auVar274._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4e0 = (float)-(uint)((int)local_5ec <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4e0 * fVar265 +
                                                                fVar263 * fVar259 +
                                                                fVar266 * fVar219)) & auVar274._8_4_
                                            ) << 0x1f) >> 0x1f) + 4);
          fStack_4dc = (float)-(uint)((int)local_5ec <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4dc * fVar265 +
                                                                fVar258 * fVar259 +
                                                                fVar271 * fVar219)) &
                                            auVar274._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar92 = ~_local_4e8 & _local_2f8;
          local_4b8 = local_4d8 + fVar251;
          fStack_4b4 = fStack_4d4 + fVar228;
          fStack_4b0 = fStack_4d0 + fVar230;
          fStack_4ac = fStack_4cc + fVar223;
          while( true ) {
            vVar43.field_0 = tp1.lower.field_0;
            local_288 = auVar92;
            uVar46 = (undefined4)((ulong)pRVar50 >> 0x20);
            iVar44 = movmskps((int)pRVar50,auVar92);
            pRVar50 = (RTCRayN *)CONCAT44(uVar46,iVar44);
            if (iVar44 == 0) break;
            uVar58 = auVar92._0_4_;
            uVar61 = auVar92._4_4_;
            uVar59 = auVar92._8_4_;
            uVar62 = auVar92._12_4_;
            auVar121._0_4_ = uVar58 & (uint)fVar251;
            auVar121._4_4_ = uVar61 & (uint)fVar228;
            auVar121._8_4_ = uVar59 & (uint)fVar230;
            auVar121._12_4_ = uVar62 & (uint)fVar223;
            auVar136._0_8_ = CONCAT44(~uVar61,~uVar58) & 0x7f8000007f800000;
            auVar136._8_4_ = ~uVar59 & 0x7f800000;
            auVar136._12_4_ = ~uVar62 & 0x7f800000;
            auVar136 = auVar136 | auVar121;
            auVar149._4_4_ = auVar136._0_4_;
            auVar149._0_4_ = auVar136._4_4_;
            auVar149._8_4_ = auVar136._12_4_;
            auVar149._12_4_ = auVar136._8_4_;
            auVar73 = minps(auVar149,auVar136);
            auVar122._0_8_ = auVar73._8_8_;
            auVar122._8_4_ = auVar73._0_4_;
            auVar122._12_4_ = auVar73._4_4_;
            auVar73 = minps(auVar122,auVar73);
            auVar123._0_8_ =
                 CONCAT44(-(uint)(auVar73._4_4_ == auVar136._4_4_) & uVar61,
                          -(uint)(auVar73._0_4_ == auVar136._0_4_) & uVar58);
            auVar123._8_4_ = -(uint)(auVar73._8_4_ == auVar136._8_4_) & uVar59;
            auVar123._12_4_ = -(uint)(auVar73._12_4_ == auVar136._12_4_) & uVar62;
            iVar44 = movmskps(iVar44,auVar123);
            if (iVar44 != 0) {
              auVar92._8_4_ = auVar123._8_4_;
              auVar92._0_8_ = auVar123._0_8_;
              auVar92._12_4_ = auVar123._12_4_;
            }
            uVar45 = movmskps(iVar44,auVar92);
            uVar49 = CONCAT44(uVar46,uVar45);
            pRVar50 = (RTCRayN *)0x0;
            if (uVar49 != 0) {
              for (; (uVar49 >> (long)pRVar50 & 1) == 0; pRVar50 = pRVar50 + 1) {
              }
            }
            *(undefined4 *)(local_288 + (long)pRVar50 * 4) = 0;
            fVar270 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar275 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar279 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar283 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar14._4_4_ = fStack_494;
            auVar14._0_4_ = local_498;
            auVar14._8_4_ = fStack_490;
            auVar14._12_4_ = fStack_48c;
            auVar21._4_4_ = fVar160;
            auVar21._0_4_ = fVar159;
            auVar21._8_4_ = fVar161;
            auVar21._12_4_ = fVar170;
            auVar253 = minps(auVar14,auVar21);
            auVar195 = maxps(auVar14,auVar21);
            auVar19._4_4_ = fVar209;
            auVar19._0_4_ = fVar171;
            auVar19._8_4_ = fVar224;
            auVar19._12_4_ = fVar227;
            auVar17._4_4_ = fVar130;
            auVar17._0_4_ = fVar131;
            auVar17._8_4_ = fVar132;
            auVar17._12_4_ = fVar229;
            auVar73 = minps(auVar19,auVar17);
            auVar253 = minps(auVar253,auVar73);
            auVar73 = maxps(auVar19,auVar17);
            auVar195 = maxps(auVar195,auVar73);
            auVar150._0_8_ = auVar253._0_8_ & 0x7fffffff7fffffff;
            auVar150._8_4_ = auVar253._8_4_ & 0x7fffffff;
            auVar150._12_4_ = auVar253._12_4_ & 0x7fffffff;
            auVar93._0_8_ = auVar195._0_8_ & 0x7fffffff7fffffff;
            auVar93._8_4_ = auVar195._8_4_ & 0x7fffffff;
            auVar93._12_4_ = ABS(auVar195._12_4_);
            auVar73 = maxps(auVar150,auVar93);
            fVar287 = auVar73._4_4_;
            if (auVar73._4_4_ <= auVar73._0_4_) {
              fVar287 = auVar73._0_4_;
            }
            auVar151._8_8_ = auVar73._8_8_;
            auVar151._0_8_ = auVar73._8_8_;
            if (auVar73._8_4_ <= fVar287) {
              auVar151._0_4_ = fVar287;
            }
            fVar300 = auVar151._0_4_ * 1.9073486e-06;
            fVar287 = *(float *)(local_108 + (long)pRVar50 * 4);
            fVar296 = local_118[(long)(pRVar50 + -8)];
            lVar47 = 5;
            do {
              bVar55 = lVar47 == 0;
              lVar47 = lVar47 + -1;
              if (bVar55) goto LAB_0029c14b;
              fVar173 = SQRT(fVar279 * fVar279 + fVar275 * fVar275 + fVar270 * fVar270) *
                        1.9073486e-06 * fVar296;
              fVar304 = 1.0 - fVar287;
              fVar313 = fVar159 * fVar304 + fVar171 * fVar287;
              fVar316 = fVar160 * fVar304 + fVar209 * fVar287;
              fVar205 = fVar161 * fVar304 + fVar224 * fVar287;
              fVar208 = fVar170 * fVar304 + fVar227 * fVar287;
              fVar207 = (local_498 * fVar304 + fVar159 * fVar287) * fVar304 + fVar287 * fVar313;
              fVar210 = (fStack_494 * fVar304 + fVar160 * fVar287) * fVar304 + fVar287 * fVar316;
              fVar220 = (fStack_490 * fVar304 + fVar161 * fVar287) * fVar304 + fVar287 * fVar205;
              fVar308 = (fStack_48c * fVar304 + fVar170 * fVar287) * fVar304 + fVar287 * fVar208;
              fVar231 = fVar313 * fVar304 + (fVar171 * fVar304 + fVar131 * fVar287) * fVar287;
              fVar263 = fVar316 * fVar304 + (fVar209 * fVar304 + fVar130 * fVar287) * fVar287;
              fVar258 = fVar205 * fVar304 + (fVar224 * fVar304 + fVar132 * fVar287) * fVar287;
              fVar313 = fVar208 * fVar304 + (fVar227 * fVar304 + fVar229 * fVar287) * fVar287;
              fVar260 = fVar304 * fVar308 + fVar287 * fVar313;
              local_4a8 = (fVar231 - fVar207) * 3.0;
              fStack_4a4 = (fVar263 - fVar210) * 3.0;
              fStack_4a0 = (fVar258 - fVar220) * 3.0;
              fStack_49c = (fVar313 - fVar308) * 3.0;
              fVar308 = fVar304 * 6.0;
              fVar208 = (fVar287 - (fVar304 + fVar304)) * 6.0;
              fVar222 = (fVar304 - (fVar287 + fVar287)) * 6.0;
              fVar205 = fVar287 * 6.0;
              fVar313 = fVar308 * local_498 +
                        fVar208 * fVar159 + fVar222 * fVar171 + fVar205 * fVar131;
              fVar316 = fVar308 * fStack_494 +
                        fVar208 * fVar160 + fVar222 * fVar209 + fVar205 * fVar130;
              fVar308 = fVar308 * fStack_490 +
                        fVar208 * fVar161 + fVar222 * fVar224 + fVar205 * fVar132;
              fVar205 = (fVar296 * fVar270 + 0.0) - (fVar304 * fVar207 + fVar287 * fVar231);
              fVar207 = (fVar296 * fVar275 + 0.0) - (fVar304 * fVar210 + fVar287 * fVar263);
              fVar208 = (fVar296 * fVar279 + 0.0) - (fVar304 * fVar220 + fVar287 * fVar258);
              fVar210 = (fVar296 * fVar283 + 0.0) - fVar260;
              fVar304 = fVar207 * fVar207;
              fStack_380 = fVar208 * fVar208;
              fStack_37c = fVar210 * fVar210;
              local_388._0_4_ = fVar304 + fVar205 * fVar205 + fStack_380;
              local_388._4_4_ = fVar304 + fVar304 + fStack_37c;
              fStack_380 = fVar304 + fStack_380 + fStack_380;
              fStack_37c = fVar304 + fStack_37c + fStack_37c;
              fVar304 = fVar300;
              if (fVar300 <= fVar173) {
                fVar304 = fVar173;
              }
              fVar269 = -local_4a8;
              fVar280 = -fStack_4a4;
              fVar284 = -fStack_4a0;
              fVar272 = -fStack_49c;
              fVar220 = fStack_4a4 * fStack_4a4 + local_4a8 * local_4a8 + fStack_4a0 * fStack_4a0;
              auVar253 = ZEXT416((uint)fVar220);
              auVar73 = rsqrtss(ZEXT416((uint)fVar220),auVar253);
              fVar173 = auVar73._0_4_;
              fVar222 = fVar173 * 1.5 - fVar173 * fVar173 * fVar220 * 0.5 * fVar173;
              fVar261 = local_4a8 * fVar222;
              fVar266 = fStack_4a4 * fVar222;
              fVar271 = fStack_4a0 * fVar222;
              fVar276 = fStack_49c * fVar222;
              fVar268 = fStack_4a0 * fVar308 + fStack_4a4 * fVar316 + local_4a8 * fVar313;
              auVar73 = rcpss(auVar253,auVar253);
              fVar173 = (2.0 - fVar220 * auVar73._0_4_) * auVar73._0_4_;
              fVar231 = fVar207 * fVar266;
              fVar263 = fVar208 * fVar271;
              fVar258 = fVar210 * fVar276;
              fVar278 = fVar231 + fVar205 * fVar261 + fVar263;
              fVar281 = fVar231 + fVar231 + fVar258;
              fVar263 = fVar231 + fVar263 + fVar263;
              fVar258 = fVar231 + fVar258 + fVar258;
              fVar277 = (SQRT((float)local_388._0_4_) + 1.0) * (fVar300 / SQRT(fVar220)) +
                        SQRT((float)local_388._0_4_) * fVar300 + fVar304;
              fVar231 = fVar276 * fVar272;
              fVar316 = fVar271 * fVar284 + fVar266 * fVar280 + fVar261 * fVar269 +
                        fVar173 * (fVar220 * fVar308 - fVar268 * fStack_4a0) * fVar222 * fVar208 +
                        fVar173 * (fVar220 * fVar316 - fVar268 * fStack_4a4) * fVar222 * fVar207 +
                        fVar173 * (fVar220 * fVar313 - fVar268 * local_4a8) * fVar222 * fVar205;
              fVar173 = fVar279 * fVar271 + fVar275 * fVar266 + fVar270 * fVar261;
              fVar308 = (float)local_388._0_4_ - fVar278 * fVar278;
              auVar94._0_8_ = CONCAT44((float)local_388._4_4_ - fVar281 * fVar281,fVar308);
              auVar94._8_4_ = fStack_380 - fVar263 * fVar263;
              auVar94._12_4_ = fStack_37c - fVar258 * fVar258;
              auVar124._8_4_ = auVar94._8_4_;
              auVar124._0_8_ = auVar94._0_8_;
              auVar124._12_4_ = auVar94._12_4_;
              auVar73 = rsqrtss(auVar124,auVar94);
              fVar313 = auVar73._0_4_;
              fVar313 = fVar313 * 1.5 - fVar313 * fVar313 * fVar308 * 0.5 * fVar313;
              if (fVar308 < 0.0) {
                fVar308 = sqrtf(fVar308);
                pRVar50 = extraout_RAX;
                uVar53 = extraout_RDX;
              }
              else {
                fVar308 = SQRT(fVar308);
              }
              fVar308 = fVar308 - fVar260;
              fVar220 = ((fVar284 * fVar208 + fVar280 * fVar207 + fVar269 * fVar205) -
                        fVar278 * fVar316) * fVar313 - fStack_49c;
              fVar313 = ((fVar279 * fVar208 + fVar275 * fVar207 + fVar270 * fVar205) -
                        fVar278 * fVar173) * fVar313;
              auVar166._0_4_ = (uint)fVar220 ^ (uint)DAT_01f46720;
              auVar167._4_4_ = (uint)(fVar272 * fVar210) ^ DAT_01f46720._4_4_;
              auVar167._0_4_ = auVar166._0_4_;
              auVar199._4_4_ = fVar231;
              auVar199._0_4_ = fVar316;
              auVar152._0_4_ = fVar316 * fVar313 - fVar173 * fVar220;
              auVar167._8_4_ = auVar167._4_4_;
              auVar167._12_4_ = fVar283 * fVar210;
              auVar166._8_8_ = auVar167._8_8_;
              auVar166._4_4_ = fVar313;
              auVar152._4_4_ = auVar152._0_4_;
              auVar152._8_4_ = auVar152._0_4_;
              auVar152._12_4_ = auVar152._0_4_;
              auVar73 = divps(auVar166,auVar152);
              auVar199._8_4_ = fVar231;
              auVar199._12_4_ = (uint)(fVar283 * fVar276) ^ DAT_01f46720._4_4_;
              auVar198._8_8_ = auVar199._8_8_;
              auVar198._4_4_ = (uint)fVar173 ^ (uint)DAT_01f46720;
              auVar198._0_4_ = fVar316;
              auVar253 = divps(auVar198,auVar152);
              fVar296 = fVar296 - (fVar308 * auVar253._0_4_ + fVar278 * auVar73._0_4_);
              fVar287 = fVar287 - (fVar308 * auVar253._4_4_ + fVar278 * auVar73._4_4_);
            } while ((fVar277 <= ABS(fVar278)) ||
                    (auVar195._12_4_ * 1.9073486e-06 + fVar304 + fVar277 <= ABS(fVar308)));
            fVar296 = local_2d8._0_4_ + fVar296;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar296) &&
               (((fVar270 = (ray->super_RayK<1>).tfar, fVar296 <= fVar270 && (0.0 <= fVar287)) &&
                (fVar287 <= 1.0)))) {
              auVar73 = rsqrtss(_local_388,_local_388);
              fVar275 = auVar73._0_4_;
              pGVar8 = (context->scene->geometries).items[uVar57].ptr;
              uVar58 = (ray->super_RayK<1>).mask;
              pRVar50 = (RTCRayN *)(ulong)uVar58;
              if ((pGVar8->mask & uVar58) != 0) {
                fVar275 = fVar275 * 1.5 +
                          fVar275 * fVar275 * (float)local_388._0_4_ * -0.5 * fVar275;
                fVar205 = fVar205 * fVar275;
                fVar207 = fVar207 * fVar275;
                fVar208 = fVar208 * fVar275;
                fVar275 = fStack_49c * fVar205 + local_4a8;
                fVar279 = fStack_49c * fVar207 + fStack_4a4;
                fVar283 = fStack_49c * fVar208 + fStack_4a0;
                fVar304 = fVar207 * local_4a8 - fStack_4a4 * fVar205;
                fVar308 = fVar208 * fStack_4a4 - fStack_4a0 * fVar207;
                fVar313 = fVar205 * fStack_4a0 - local_4a8 * fVar208;
                fVar300 = fVar279 * fVar308 - fVar313 * fVar275;
                uVar107 = CONCAT44(fVar275 * fVar304 - fVar308 * fVar283,
                                   fVar283 * fVar313 - fVar304 * fVar279);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar296;
                  *(undefined8 *)&(ray->Ng).field_0 = uVar107;
                  (ray->Ng).field_0.field_0.z = fVar300;
                  ray->u = fVar287;
                  ray->v = 0.0;
                  ray->primID = uVar56;
                  ray->geomID = uVar57;
                  ray->instID[0] = context->user->instID[0];
                  uVar58 = context->user->instPrimID[0];
                  ray->instPrimID[0] = uVar58;
                  pRVar50 = (RTCRayN *)(ulong)uVar58;
                }
                else {
                  vu0.field_0._0_8_ = uVar107;
                  vu0.field_0.v[2] = fVar300;
                  vu0.field_0.v[3] = fVar287;
                  (ray->super_RayK<1>).tfar = fVar296;
                  local_328._0_4_ = 0xffffffff;
                  args.geometryUserPtr = pGVar8->userPtr;
                  args.valid = (int *)local_328;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&vu0;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0029c24a:
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&args);
                      uVar53 = extraout_RDX_01;
                      if (*args.valid == 0) goto LAB_0029c2d9;
                    }
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    uVar53 = (ulong)*(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                    *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
                    pRVar50 = args.ray;
                  }
                  else {
                    (*pGVar8->intersectionFilterN)(&args);
                    uVar53 = extraout_RDX_00;
                    if (*args.valid != 0) goto LAB_0029c24a;
LAB_0029c2d9:
                    (ray->super_RayK<1>).tfar = fVar270;
                    pRVar50 = (RTCRayN *)args.valid;
                  }
                }
              }
            }
LAB_0029c14b:
            fVar270 = (ray->super_RayK<1>).tfar;
            auVar92._0_4_ = -(uint)(local_4b8 <= fVar270) & local_288._0_4_;
            auVar92._4_4_ = -(uint)(fStack_4b4 <= fVar270) & local_288._4_4_;
            auVar92._8_4_ = -(uint)(fStack_4b0 <= fVar270) & local_288._8_4_;
            auVar92._12_4_ = -(uint)(fStack_4ac <= fVar270) & local_288._12_4_;
          }
          fVar270 = (ray->super_RayK<1>).tfar;
          auVar153._0_4_ = -(uint)(aVar243.v[0] + local_4d8 <= fVar270) & local_2e8._0_4_;
          auVar153._4_4_ = -(uint)(aVar243.v[1] + fStack_4d4 <= fVar270) & local_2e8._4_4_;
          auVar153._8_4_ = -(uint)(aVar243.v[2] + fStack_4d0 <= fVar270) & (uint)fStack_2e0;
          auVar153._12_4_ = -(uint)(aVar243.v[3] + fStack_4cc <= fVar270) & (uint)fStack_2dc;
          auVar125._0_4_ =
               -(uint)((int)local_308._0_4_ <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5a8._0_4_ * fVar219 +
                                                 auVar165._0_4_ * fVar259 + fVar204 * fVar265)) &
                             auVar274._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar125._4_4_ =
               -(uint)((int)local_308._4_4_ <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5a8._4_4_ * fVar219 +
                                                 auVar165._4_4_ * fVar259 + fVar257 * fVar265)) &
                             auVar274._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar125._8_4_ =
               -(uint)((int)local_308._8_4_ <
                      ((int)((-(uint)(0.3 <= ABS(fStack_5a0 * fVar219 +
                                                 auVar165._8_4_ * fVar259 + fVar262 * fVar265)) &
                             auVar274._8_4_) << 0x1f) >> 0x1f) + 4);
          auVar125._12_4_ =
               -(uint)((int)local_308._12_4_ <
                      ((int)((-(uint)(0.3 <= ABS(fStack_59c * fVar219 +
                                                 auVar165._12_4_ * fVar259 + fVar267 * fVar265)) &
                             auVar274._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar126 = ~auVar125 & auVar153;
          local_4b8 = local_4d8 + tp1.lower.field_0.v[0];
          fStack_4b4 = fStack_4d4 + tp1.lower.field_0.v[1];
          fStack_4b0 = fStack_4d0 + tp1.lower.field_0.v[2];
          fStack_4ac = fStack_4cc + tp1.lower.field_0.v[3];
          while( true ) {
            local_328 = auVar126;
            iVar44 = movmskps((int)pRVar50,auVar126);
            if (iVar44 == 0) break;
            auVar253 = ~auVar126 & _DAT_01f45a30 | auVar126 & (undefined1  [16])vVar43.field_0;
            auVar154._4_4_ = auVar253._0_4_;
            auVar154._0_4_ = auVar253._4_4_;
            auVar154._8_4_ = auVar253._12_4_;
            auVar154._12_4_ = auVar253._8_4_;
            auVar73 = minps(auVar154,auVar253);
            auVar95._0_8_ = auVar73._8_8_;
            auVar95._8_4_ = auVar73._0_4_;
            auVar95._12_4_ = auVar73._4_4_;
            auVar73 = minps(auVar95,auVar73);
            auVar96._0_8_ =
                 CONCAT44(-(uint)(auVar73._4_4_ == auVar253._4_4_) & auVar126._4_4_,
                          -(uint)(auVar73._0_4_ == auVar253._0_4_) & auVar126._0_4_);
            auVar96._8_4_ = -(uint)(auVar73._8_4_ == auVar253._8_4_) & auVar126._8_4_;
            auVar96._12_4_ = -(uint)(auVar73._12_4_ == auVar253._12_4_) & auVar126._12_4_;
            iVar44 = movmskps(iVar44,auVar96);
            if (iVar44 != 0) {
              auVar126._8_4_ = auVar96._8_4_;
              auVar126._0_8_ = auVar96._0_8_;
              auVar126._12_4_ = auVar96._12_4_;
            }
            uVar46 = movmskps(iVar44,auVar126);
            uVar49 = CONCAT44((int)((ulong)pRVar50 >> 0x20),uVar46);
            pRVar50 = (RTCRayN *)0x0;
            if (uVar49 != 0) {
              for (; (uVar49 >> (long)pRVar50 & 1) == 0; pRVar50 = pRVar50 + 1) {
              }
            }
            *(undefined4 *)(local_328 + (long)pRVar50 * 4) = 0;
            fVar204 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar219 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar257 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar259 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar15._4_4_ = fStack_494;
            auVar15._0_4_ = local_498;
            auVar15._8_4_ = fStack_490;
            auVar15._12_4_ = fStack_48c;
            auVar22._4_4_ = fVar160;
            auVar22._0_4_ = fVar159;
            auVar22._8_4_ = fVar161;
            auVar22._12_4_ = fVar170;
            auVar253 = minps(auVar15,auVar22);
            auVar195 = maxps(auVar15,auVar22);
            auVar20._4_4_ = fVar209;
            auVar20._0_4_ = fVar171;
            auVar20._8_4_ = fVar224;
            auVar20._12_4_ = fVar227;
            auVar18._4_4_ = fVar130;
            auVar18._0_4_ = fVar131;
            auVar18._8_4_ = fVar132;
            auVar18._12_4_ = fVar229;
            auVar73 = minps(auVar20,auVar18);
            auVar253 = minps(auVar253,auVar73);
            auVar73 = maxps(auVar20,auVar18);
            auVar195 = maxps(auVar195,auVar73);
            auVar155._0_8_ = auVar253._0_8_ & 0x7fffffff7fffffff;
            auVar155._8_4_ = auVar253._8_4_ & 0x7fffffff;
            auVar155._12_4_ = auVar253._12_4_ & 0x7fffffff;
            auVar97._0_8_ = auVar195._0_8_ & 0x7fffffff7fffffff;
            auVar97._8_4_ = auVar195._8_4_ & 0x7fffffff;
            auVar97._12_4_ = ABS(auVar195._12_4_);
            auVar73 = maxps(auVar155,auVar97);
            fVar262 = auVar73._4_4_;
            if (auVar73._4_4_ <= auVar73._0_4_) {
              fVar262 = auVar73._0_4_;
            }
            auVar156._8_8_ = auVar73._8_8_;
            auVar156._0_8_ = auVar73._8_8_;
            if (auVar73._8_4_ <= fVar262) {
              auVar156._0_4_ = fVar262;
            }
            fVar267 = auVar156._0_4_ * 1.9073486e-06;
            fVar262 = local_118[(long)pRVar50];
            fVar265 = tp1.upper.field_0.v[(long)pRVar50];
            lVar47 = 5;
            do {
              bVar55 = lVar47 == 0;
              lVar47 = lVar47 + -1;
              if (bVar55) goto LAB_0029cb01;
              fVar287 = SQRT(fVar257 * fVar257 + fVar219 * fVar219 + fVar204 * fVar204) *
                        1.9073486e-06 * fVar265;
              fVar270 = 1.0 - fVar262;
              fVar279 = fVar159 * fVar270 + fVar171 * fVar262;
              fVar283 = fVar160 * fVar270 + fVar209 * fVar262;
              fVar296 = fVar161 * fVar270 + fVar224 * fVar262;
              fVar304 = fVar170 * fVar270 + fVar227 * fVar262;
              fVar300 = (local_498 * fVar270 + fVar159 * fVar262) * fVar270 + fVar262 * fVar279;
              fVar308 = (fStack_494 * fVar270 + fVar160 * fVar262) * fVar270 + fVar262 * fVar283;
              fVar313 = (fStack_490 * fVar270 + fVar161 * fVar262) * fVar270 + fVar262 * fVar296;
              fVar275 = (fStack_48c * fVar270 + fVar170 * fVar262) * fVar270 + fVar262 * fVar304;
              fVar205 = fVar279 * fVar270 + (fVar171 * fVar270 + fVar131 * fVar262) * fVar262;
              fVar207 = fVar283 * fVar270 + (fVar209 * fVar270 + fVar130 * fVar262) * fVar262;
              fVar208 = fVar296 * fVar270 + (fVar224 * fVar270 + fVar132 * fVar262) * fVar262;
              fVar279 = fVar304 * fVar270 + (fVar227 * fVar270 + fVar229 * fVar262) * fVar262;
              fVar173 = fVar270 * fVar275 + fVar262 * fVar279;
              local_4a8 = (fVar205 - fVar300) * 3.0;
              fStack_4a4 = (fVar207 - fVar308) * 3.0;
              fStack_4a0 = (fVar208 - fVar313) * 3.0;
              fStack_49c = (fVar279 - fVar275) * 3.0;
              fVar275 = fVar270 * 6.0;
              fVar304 = (fVar262 - (fVar270 + fVar270)) * 6.0;
              fVar316 = (fVar270 - (fVar262 + fVar262)) * 6.0;
              fVar296 = fVar262 * 6.0;
              fVar279 = fVar275 * local_498 +
                        fVar304 * fVar159 + fVar316 * fVar171 + fVar296 * fVar131;
              fVar283 = fVar275 * fStack_494 +
                        fVar304 * fVar160 + fVar316 * fVar209 + fVar296 * fVar130;
              fVar275 = fVar275 * fStack_490 +
                        fVar304 * fVar161 + fVar316 * fVar224 + fVar296 * fVar132;
              fVar296 = (fVar265 * fVar204 + 0.0) - (fVar270 * fVar300 + fVar262 * fVar205);
              fVar300 = (fVar265 * fVar219 + 0.0) - (fVar270 * fVar308 + fVar262 * fVar207);
              fVar304 = (fVar265 * fVar257 + 0.0) - (fVar270 * fVar313 + fVar262 * fVar208);
              fVar308 = (fVar265 * fVar259 + 0.0) - fVar173;
              fVar270 = fVar300 * fVar300;
              fStack_380 = fVar304 * fVar304;
              fStack_37c = fVar308 * fVar308;
              local_388._0_4_ = fVar270 + fVar296 * fVar296 + fStack_380;
              local_388._4_4_ = fVar270 + fVar270 + fStack_37c;
              fStack_380 = fVar270 + fStack_380 + fStack_380;
              fStack_37c = fVar270 + fStack_37c + fStack_37c;
              fVar270 = fVar267;
              if (fVar267 <= fVar287) {
                fVar270 = fVar287;
              }
              fVar220 = -local_4a8;
              fVar222 = -fStack_4a4;
              fVar231 = -fStack_4a0;
              fVar263 = -fStack_49c;
              fVar313 = fStack_4a4 * fStack_4a4 + local_4a8 * local_4a8 + fStack_4a0 * fStack_4a0;
              auVar73 = ZEXT416((uint)fVar313);
              auVar253 = rsqrtss(ZEXT416((uint)fVar313),auVar73);
              fVar287 = auVar253._0_4_;
              fVar316 = fVar287 * 1.5 - fVar287 * fVar287 * fVar313 * 0.5 * fVar287;
              fVar258 = local_4a8 * fVar316;
              fVar260 = fStack_4a4 * fVar316;
              fVar261 = fStack_4a0 * fVar316;
              fVar266 = fStack_49c * fVar316;
              fVar210 = fStack_4a0 * fVar275 + fStack_4a4 * fVar283 + local_4a8 * fVar279;
              auVar73 = rcpss(auVar73,auVar73);
              fVar287 = (2.0 - fVar313 * auVar73._0_4_) * auVar73._0_4_;
              fVar205 = fVar300 * fVar260;
              fVar207 = fVar304 * fVar261;
              fVar208 = fVar308 * fVar266;
              fVar276 = fVar205 + fVar296 * fVar258 + fVar207;
              fVar268 = fVar205 + fVar205 + fVar208;
              fVar207 = fVar205 + fVar207 + fVar207;
              fVar208 = fVar205 + fVar208 + fVar208;
              fVar271 = (SQRT((float)local_388._0_4_) + 1.0) * (fVar267 / SQRT(fVar313)) +
                        SQRT((float)local_388._0_4_) * fVar267 + fVar270;
              fVar205 = fVar266 * fVar263;
              fVar283 = fVar261 * fVar231 + fVar260 * fVar222 + fVar258 * fVar220 +
                        fVar287 * (fVar313 * fVar275 - fVar210 * fStack_4a0) * fVar316 * fVar304 +
                        fVar287 * (fVar313 * fVar283 - fVar210 * fStack_4a4) * fVar316 * fVar300 +
                        fVar287 * (fVar313 * fVar279 - fVar210 * local_4a8) * fVar316 * fVar296;
              fVar287 = fVar257 * fVar261 + fVar219 * fVar260 + fVar204 * fVar258;
              fVar275 = (float)local_388._0_4_ - fVar276 * fVar276;
              auVar98._0_8_ = CONCAT44((float)local_388._4_4_ - fVar268 * fVar268,fVar275);
              auVar98._8_4_ = fStack_380 - fVar207 * fVar207;
              auVar98._12_4_ = fStack_37c - fVar208 * fVar208;
              auVar127._8_4_ = auVar98._8_4_;
              auVar127._0_8_ = auVar98._0_8_;
              auVar127._12_4_ = auVar98._12_4_;
              auVar73 = rsqrtss(auVar127,auVar98);
              fVar279 = auVar73._0_4_;
              fVar279 = fVar279 * 1.5 - fVar279 * fVar279 * fVar275 * 0.5 * fVar279;
              if (fVar275 < 0.0) {
                fVar275 = sqrtf(fVar275);
                pRVar50 = extraout_RAX_00;
                uVar53 = extraout_RDX_02;
              }
              else {
                fVar275 = SQRT(fVar275);
              }
              fVar275 = fVar275 - fVar173;
              fVar313 = ((fVar231 * fVar304 + fVar222 * fVar300 + fVar220 * fVar296) -
                        fVar276 * fVar283) * fVar279 - fStack_49c;
              fVar279 = ((fVar257 * fVar304 + fVar219 * fVar300 + fVar204 * fVar296) -
                        fVar276 * fVar287) * fVar279;
              auVar168._0_4_ = (uint)fVar313 ^ (uint)DAT_01f46720;
              auVar169._4_4_ = (uint)(fVar263 * fVar308) ^ DAT_01f46720._4_4_;
              auVar169._0_4_ = auVar168._0_4_;
              auVar201._4_4_ = fVar205;
              auVar201._0_4_ = fVar283;
              auVar157._0_4_ = fVar283 * fVar279 - fVar287 * fVar313;
              auVar169._8_4_ = auVar169._4_4_;
              auVar169._12_4_ = fVar259 * fVar308;
              auVar168._8_8_ = auVar169._8_8_;
              auVar168._4_4_ = fVar279;
              auVar157._4_4_ = auVar157._0_4_;
              auVar157._8_4_ = auVar157._0_4_;
              auVar157._12_4_ = auVar157._0_4_;
              auVar73 = divps(auVar168,auVar157);
              auVar201._8_4_ = fVar205;
              auVar201._12_4_ = (uint)(fVar259 * fVar266) ^ DAT_01f46720._4_4_;
              auVar200._8_8_ = auVar201._8_8_;
              auVar200._4_4_ = (uint)fVar287 ^ (uint)DAT_01f46720;
              auVar200._0_4_ = fVar283;
              auVar253 = divps(auVar200,auVar157);
              fVar265 = fVar265 - (fVar275 * auVar253._0_4_ + fVar276 * auVar73._0_4_);
              fVar262 = fVar262 - (fVar275 * auVar253._4_4_ + fVar276 * auVar73._4_4_);
            } while ((fVar271 <= ABS(fVar276)) ||
                    (auVar195._12_4_ * 1.9073486e-06 + fVar270 + fVar271 <= ABS(fVar275)));
            fVar265 = local_2d8._0_4_ + fVar265;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar265) &&
               (((fVar204 = (ray->super_RayK<1>).tfar, fVar265 <= fVar204 && (0.0 <= fVar262)) &&
                (fVar262 <= 1.0)))) {
              auVar73 = rsqrtss(_local_388,_local_388);
              fVar219 = auVar73._0_4_;
              pGVar8 = (context->scene->geometries).items[uVar57].ptr;
              uVar58 = (ray->super_RayK<1>).mask;
              pRVar50 = (RTCRayN *)(ulong)uVar58;
              if ((pGVar8->mask & uVar58) != 0) {
                fVar219 = fVar219 * 1.5 +
                          fVar219 * fVar219 * (float)local_388._0_4_ * -0.5 * fVar219;
                fVar296 = fVar296 * fVar219;
                fVar300 = fVar300 * fVar219;
                fVar304 = fVar304 * fVar219;
                fVar219 = fStack_49c * fVar296 + local_4a8;
                fVar257 = fStack_49c * fVar300 + fStack_4a4;
                fVar259 = fStack_49c * fVar304 + fStack_4a0;
                fVar270 = fVar300 * local_4a8 - fStack_4a4 * fVar296;
                fVar275 = fVar304 * fStack_4a4 - fStack_4a0 * fVar300;
                fVar279 = fVar296 * fStack_4a0 - local_4a8 * fVar304;
                fVar267 = fVar257 * fVar275 - fVar279 * fVar219;
                uVar107 = CONCAT44(fVar219 * fVar270 - fVar275 * fVar259,
                                   fVar259 * fVar279 - fVar270 * fVar257);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar265;
                  *(undefined8 *)&(ray->Ng).field_0 = uVar107;
                  (ray->Ng).field_0.field_0.z = fVar267;
                  ray->u = fVar262;
                  ray->v = 0.0;
                  ray->primID = uVar56;
                  ray->geomID = uVar57;
                  ray->instID[0] = context->user->instID[0];
                  uVar58 = context->user->instPrimID[0];
                  ray->instPrimID[0] = uVar58;
                  pRVar50 = (RTCRayN *)(ulong)uVar58;
                }
                else {
                  vu0.field_0._0_8_ = uVar107;
                  vu0.field_0.v[2] = fVar267;
                  vu0.field_0.v[3] = fVar262;
                  (ray->super_RayK<1>).tfar = fVar265;
                  local_4ec = -1;
                  args.geometryUserPtr = pGVar8->userPtr;
                  args.valid = &local_4ec;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&vu0;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0029cc08:
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&args);
                      uVar53 = extraout_RDX_04;
                      if (*args.valid == 0) goto LAB_0029cca4;
                    }
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    uVar53 = (ulong)*(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                    *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
                    pRVar50 = args.ray;
                  }
                  else {
                    (*pGVar8->intersectionFilterN)(&args);
                    uVar53 = extraout_RDX_03;
                    if (*args.valid != 0) goto LAB_0029cc08;
LAB_0029cca4:
                    (ray->super_RayK<1>).tfar = fVar204;
                    pRVar50 = (RTCRayN *)args.valid;
                  }
                }
              }
            }
LAB_0029cb01:
            fVar270 = (ray->super_RayK<1>).tfar;
            auVar126._0_4_ = -(uint)(local_4b8 <= fVar270) & local_328._0_4_;
            auVar126._4_4_ = -(uint)(fStack_4b4 <= fVar270) & local_328._4_4_;
            auVar126._8_4_ = -(uint)(fStack_4b0 <= fVar270) & local_328._8_4_;
            auVar126._12_4_ = -(uint)(fStack_4ac <= fVar270) & local_328._12_4_;
          }
          auVar202._0_4_ =
               local_4e8._0_4_ & local_2f8._0_4_ & -(uint)(local_4d8 + fVar251 <= fVar270);
          auVar202._4_4_ =
               local_4e8._4_4_ & local_2f8._4_4_ & -(uint)(fStack_4d4 + fVar228 <= fVar270);
          auVar202._8_4_ =
               (uint)fStack_4e0 & (uint)fStack_2f0 & -(uint)(fStack_4d0 + fVar230 <= fVar270);
          auVar202._12_4_ =
               (uint)fStack_4dc & (uint)fStack_2ec & -(uint)(fStack_4cc + fVar223 <= fVar270);
          auVar99._0_4_ =
               auVar125._0_4_ & auVar153._0_4_ &
               -(uint)(local_4d8 + tp1.lower.field_0.v[0] <= fVar270);
          auVar99._4_4_ =
               auVar125._4_4_ & auVar153._4_4_ &
               -(uint)(fStack_4d4 + tp1.lower.field_0.v[1] <= fVar270);
          auVar99._8_4_ =
               auVar125._8_4_ & auVar153._8_4_ &
               -(uint)(fStack_4d0 + tp1.lower.field_0.v[2] <= fVar270);
          auVar99._12_4_ =
               auVar125._12_4_ & auVar153._12_4_ &
               -(uint)(fStack_4cc + tp1.lower.field_0.v[3] <= fVar270);
          uVar58 = movmskps(0,auVar99 | auVar202);
          pRVar50 = (RTCRayN *)(ulong)uVar58;
          if (uVar58 != 0) {
            pRVar50 = (RTCRayN *)(uVar52 * 0x30);
            stack[uVar52].valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar99 | auVar202);
            stack[uVar52].tlower.field_0.i[0] =
                 ~auVar202._0_4_ & tp1.lower.field_0.i[0] | (uint)fVar251 & auVar202._0_4_;
            stack[uVar52].tlower.field_0.i[1] =
                 ~auVar202._4_4_ & tp1.lower.field_0.i[1] | (uint)fVar228 & auVar202._4_4_;
            stack[uVar52].tlower.field_0.i[2] =
                 ~auVar202._8_4_ & tp1.lower.field_0.i[2] | (uint)fVar230 & auVar202._8_4_;
            stack[uVar52].tlower.field_0.i[3] =
                 ~auVar202._12_4_ & tp1.lower.field_0.i[3] | (uint)fVar223 & auVar202._12_4_;
            stack[uVar52].u0 = fVar140;
            stack[uVar52].u1 = fVar142;
            stack[uVar52].depth = local_5ec + 1;
            uVar52 = (ulong)((int)uVar52 + 1);
          }
        }
      }
    }
    fVar140 = (ray->super_RayK<1>).tfar;
    do {
      uVar49 = uVar52;
      iVar44 = (int)uVar49;
      if (iVar44 == 0) {
        auVar101._4_4_ = -(uint)(fVar104 <= fVar140);
        auVar101._0_4_ = -(uint)(fVar65 <= fVar140);
        auVar101._8_4_ = -(uint)(fVar105 <= fVar140);
        auVar101._12_4_ = -(uint)(fVar106 <= fVar140);
        uVar56 = movmskps((int)pRVar50,auVar101);
        uVar56 = (uint)uVar54 & uVar56;
        goto LAB_0029aa23;
      }
      uVar52 = (ulong)(iVar44 - 1U);
      pRVar50 = (RTCRayN *)(uVar52 * 0x30);
      fVar142 = stack[uVar52].tlower.field_0.v[0];
      fVar204 = stack[uVar52].tlower.field_0.v[1];
      fVar219 = stack[uVar52].tlower.field_0.v[2];
      fVar257 = stack[uVar52].tlower.field_0.v[3];
      args.valid._0_4_ = -(uint)(local_4d8 + fVar142 <= fVar140) & stack[uVar52].valid.field_0.i[0];
      args.valid._4_4_ = -(uint)(fStack_4d4 + fVar204 <= fVar140) & stack[uVar52].valid.field_0.i[1]
      ;
      args.geometryUserPtr._0_4_ =
           -(uint)(fStack_4d0 + fVar219 <= fVar140) & stack[uVar52].valid.field_0.i[2];
      args.geometryUserPtr._4_4_ =
           -(uint)(fStack_4cc + fVar257 <= fVar140) & stack[uVar52].valid.field_0.i[3];
      uVar58 = movmskps((int)uVar53,(undefined1  [16])args._0_16_);
      uVar53 = (ulong)uVar58;
    } while (uVar58 == 0);
    auVar137._0_4_ = (uint)fVar142 & (uint)args.valid;
    auVar137._4_4_ = (uint)fVar204 & args.valid._4_4_;
    auVar137._8_4_ = (uint)fVar219 & (uint)args.geometryUserPtr;
    auVar137._12_4_ = (uint)fVar257 & args.geometryUserPtr._4_4_;
    auVar158._0_8_ = CONCAT44(~args.valid._4_4_,~(uint)args.valid) & 0x7f8000007f800000;
    auVar158._8_4_ = ~(uint)args.geometryUserPtr & 0x7f800000;
    auVar158._12_4_ = ~args.geometryUserPtr._4_4_ & 0x7f800000;
    auVar158 = auVar158 | auVar137;
    auVar138._4_4_ = auVar158._0_4_;
    auVar138._0_4_ = auVar158._4_4_;
    auVar138._8_4_ = auVar158._12_4_;
    auVar138._12_4_ = auVar158._8_4_;
    auVar73 = minps(auVar138,auVar158);
    auVar128._0_8_ = auVar73._8_8_;
    auVar128._8_4_ = auVar73._0_4_;
    auVar128._12_4_ = auVar73._4_4_;
    auVar73 = minps(auVar128,auVar73);
    auVar129._0_8_ =
         CONCAT44(-(uint)(auVar73._4_4_ == auVar158._4_4_) & args.valid._4_4_,
                  -(uint)(auVar73._0_4_ == auVar158._0_4_) & (uint)args.valid);
    auVar129._8_4_ = -(uint)(auVar73._8_4_ == auVar158._8_4_) & (uint)args.geometryUserPtr;
    auVar129._12_4_ = -(uint)(auVar73._12_4_ == auVar158._12_4_) & args.geometryUserPtr._4_4_;
    iVar51 = movmskps(iVar44 - 1U,auVar129);
    auVar100 = (undefined1  [16])args._0_16_;
    if (iVar51 != 0) {
      auVar100._8_4_ = auVar129._8_4_;
      auVar100._0_8_ = auVar129._0_8_;
      auVar100._12_4_ = auVar129._12_4_;
    }
    pSVar48 = stack + uVar52;
    uVar58 = movmskps(iVar51,auVar100);
    lVar47 = 0;
    if (uVar58 != 0) {
      for (; (uVar58 >> lVar47 & 1) == 0; lVar47 = lVar47 + 1) {
      }
    }
    *(undefined4 *)((long)&args.valid + lVar47 * 4) = 0;
    uVar5 = stack[uVar52].u0;
    uVar6 = stack[uVar52].u1;
    local_5ec = stack[uVar52].depth;
    iVar51 = movmskps(local_5ec,(undefined1  [16])args._0_16_);
    uVar53 = (ulong)(iVar44 - 1);
    if (iVar51 != 0) {
      uVar53 = uVar49;
    }
    (pSVar48->valid).field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)args._0_16_;
    fVar140 = (float)uVar6 - (float)uVar5;
    vu0.field_0.v[1] = fVar140 * 0.33333334 + (float)uVar5;
    vu0.field_0.v[0] = fVar140 * 0.0 + (float)uVar5;
    vu0.field_0.v[2] = fVar140 * 0.6666667 + (float)uVar5;
    vu0.field_0.v[3] = fVar140 * 1.0 + (float)uVar5;
    fVar140 = vu0.field_0.v[lVar47];
    fVar142 = *(float *)((long)&vu0.field_0 + lVar47 * 4 + 4);
    uVar52 = uVar53;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }